

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  int iVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  byte bVar55;
  long lVar56;
  Geometry *geometry;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  undefined8 unaff_R12;
  ulong uVar61;
  long lVar62;
  byte bVar63;
  float fVar112;
  float fVar114;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar71 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined4 uVar118;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  vint4 bi_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  undefined8 uVar129;
  float fVar136;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  vint4 ai_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar160;
  float fVar161;
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  RTCFilterFunctionNArguments args;
  int local_54c;
  long local_548;
  Primitive *local_540;
  Ray *local_538;
  ulong local_530;
  ulong local_528;
  Precalculations *local_520;
  float local_514;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  RayQueryContext *local_498;
  Geometry *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  ulong local_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_520 = pre;
  uVar61 = (ulong)(byte)prim[1];
  fVar156 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar66 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar130._0_4_ = fVar156 * (ray->dir).field_0.m128[0];
  auVar130._4_4_ = fVar156 * (ray->dir).field_0.m128[1];
  auVar130._8_4_ = fVar156 * (ray->dir).field_0.m128[2];
  auVar130._12_4_ = fVar156 * (ray->dir).field_0.m128[3];
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar151._0_4_ = fVar156 * auVar66._0_4_;
  auVar151._4_4_ = fVar156 * auVar66._4_4_;
  auVar151._8_4_ = fVar156 * auVar66._8_4_;
  auVar151._12_4_ = fVar156 * auVar66._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xd + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x13 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x14 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar175._4_4_ = auVar130._0_4_;
  auVar175._0_4_ = auVar130._0_4_;
  auVar175._8_4_ = auVar130._0_4_;
  auVar175._12_4_ = auVar130._0_4_;
  auVar70 = vshufps_avx(auVar130,auVar130,0x55);
  auVar71 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar156 = auVar71._0_4_;
  auVar145._0_4_ = fVar156 * auVar67._0_4_;
  fVar128 = auVar71._4_4_;
  auVar145._4_4_ = fVar128 * auVar67._4_4_;
  fVar135 = auVar71._8_4_;
  auVar145._8_4_ = fVar135 * auVar67._8_4_;
  fVar136 = auVar71._12_4_;
  auVar145._12_4_ = fVar136 * auVar67._12_4_;
  auVar123._0_4_ = auVar18._0_4_ * fVar156;
  auVar123._4_4_ = auVar18._4_4_ * fVar128;
  auVar123._8_4_ = auVar18._8_4_ * fVar135;
  auVar123._12_4_ = auVar18._12_4_ * fVar136;
  auVar119._0_4_ = auVar69._0_4_ * fVar156;
  auVar119._4_4_ = auVar69._4_4_ * fVar128;
  auVar119._8_4_ = auVar69._8_4_ * fVar135;
  auVar119._12_4_ = auVar69._12_4_ * fVar136;
  auVar71 = vfmadd231ps_fma(auVar145,auVar70,auVar66);
  auVar65 = vfmadd231ps_fma(auVar123,auVar70,auVar17);
  auVar70 = vfmadd231ps_fma(auVar119,auVar20,auVar70);
  auVar64 = vfmadd231ps_fma(auVar71,auVar175,auVar68);
  auVar65 = vfmadd231ps_fma(auVar65,auVar175,auVar121);
  auVar119 = vfmadd231ps_fma(auVar70,auVar19,auVar175);
  auVar176._4_4_ = auVar151._0_4_;
  auVar176._0_4_ = auVar151._0_4_;
  auVar176._8_4_ = auVar151._0_4_;
  auVar176._12_4_ = auVar151._0_4_;
  auVar70 = vshufps_avx(auVar151,auVar151,0x55);
  auVar71 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar156 = auVar71._0_4_;
  auVar152._0_4_ = fVar156 * auVar67._0_4_;
  fVar128 = auVar71._4_4_;
  auVar152._4_4_ = fVar128 * auVar67._4_4_;
  fVar135 = auVar71._8_4_;
  auVar152._8_4_ = fVar135 * auVar67._8_4_;
  fVar136 = auVar71._12_4_;
  auVar152._12_4_ = fVar136 * auVar67._12_4_;
  auVar138._0_4_ = auVar18._0_4_ * fVar156;
  auVar138._4_4_ = auVar18._4_4_ * fVar128;
  auVar138._8_4_ = auVar18._8_4_ * fVar135;
  auVar138._12_4_ = auVar18._12_4_ * fVar136;
  auVar131._0_4_ = auVar69._0_4_ * fVar156;
  auVar131._4_4_ = auVar69._4_4_ * fVar128;
  auVar131._8_4_ = auVar69._8_4_ * fVar135;
  auVar131._12_4_ = auVar69._12_4_ * fVar136;
  auVar66 = vfmadd231ps_fma(auVar152,auVar70,auVar66);
  auVar67 = vfmadd231ps_fma(auVar138,auVar70,auVar17);
  auVar17 = vfmadd231ps_fma(auVar131,auVar70,auVar20);
  auVar18 = vfmadd231ps_fma(auVar66,auVar176,auVar68);
  auVar20 = vfmadd231ps_fma(auVar67,auVar176,auVar121);
  auVar69 = vfmadd231ps_fma(auVar17,auVar176,auVar19);
  auVar169._8_4_ = 0x7fffffff;
  auVar169._0_8_ = 0x7fffffff7fffffff;
  auVar169._12_4_ = 0x7fffffff;
  auVar68 = vandps_avx(auVar169,auVar64);
  auVar166._8_4_ = 0x219392ef;
  auVar166._0_8_ = 0x219392ef219392ef;
  auVar166._12_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar68,auVar166,1);
  bVar60 = (bool)((byte)uVar58 & 1);
  auVar71._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._0_4_;
  bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._4_4_;
  bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._8_4_;
  bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._12_4_;
  auVar68 = vandps_avx(auVar169,auVar65);
  uVar58 = vcmpps_avx512vl(auVar68,auVar166,1);
  bVar60 = (bool)((byte)uVar58 & 1);
  auVar64._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._0_4_;
  bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._4_4_;
  bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._8_4_;
  bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._12_4_;
  auVar68 = vandps_avx(auVar169,auVar119);
  uVar58 = vcmpps_avx512vl(auVar68,auVar166,1);
  bVar60 = (bool)((byte)uVar58 & 1);
  auVar65._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar119._0_4_;
  bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar119._4_4_;
  bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar119._8_4_;
  bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar119._12_4_;
  auVar66 = vrcp14ps_avx512vl(auVar71);
  auVar167._8_4_ = 0x3f800000;
  auVar167._0_8_ = 0x3f8000003f800000;
  auVar167._12_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar71,auVar66,auVar167);
  auVar121 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar64);
  auVar68 = vfnmadd213ps_fma(auVar64,auVar66,auVar167);
  auVar17 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar67 = vrcp14ps_avx512vl(auVar65);
  auVar66 = vfnmadd213ps_fma(auVar65,auVar67,auVar167);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar68 = vpmovsxwd_avx(auVar68);
  auVar19 = vfmadd132ps_fma(auVar66,auVar67,auVar67);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar67 = vsubps_avx(auVar68,auVar18);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar68 = vpmovsxwd_avx(auVar66);
  auVar157._0_4_ = auVar121._0_4_ * auVar67._0_4_;
  auVar157._4_4_ = auVar121._4_4_ * auVar67._4_4_;
  auVar157._8_4_ = auVar121._8_4_ * auVar67._8_4_;
  auVar157._12_4_ = auVar121._12_4_ * auVar67._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar66 = vsubps_avx(auVar68,auVar18);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar61 * 0xe + 6);
  auVar68 = vpmovsxwd_avx(auVar67);
  auVar146._0_4_ = auVar121._0_4_ * auVar66._0_4_;
  auVar146._4_4_ = auVar121._4_4_ * auVar66._4_4_;
  auVar146._8_4_ = auVar121._8_4_ * auVar66._8_4_;
  auVar146._12_4_ = auVar121._12_4_ * auVar66._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar20);
  auVar153._0_4_ = auVar17._0_4_ * auVar68._0_4_;
  auVar153._4_4_ = auVar17._4_4_ * auVar68._4_4_;
  auVar153._8_4_ = auVar17._8_4_ * auVar68._8_4_;
  auVar153._12_4_ = auVar17._12_4_ * auVar68._12_4_;
  auVar67 = vpbroadcastd_avx512vl();
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar68 = vpmovsxwd_avx(auVar121);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar20);
  auVar124._0_4_ = auVar17._0_4_ * auVar68._0_4_;
  auVar124._4_4_ = auVar17._4_4_ * auVar68._4_4_;
  auVar124._8_4_ = auVar17._8_4_ * auVar68._8_4_;
  auVar124._12_4_ = auVar17._12_4_ * auVar68._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar61 * 0x15 + 6);
  auVar68 = vpmovsxwd_avx(auVar17);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar139._0_4_ = auVar19._0_4_ * auVar68._0_4_;
  auVar139._4_4_ = auVar19._4_4_ * auVar68._4_4_;
  auVar139._8_4_ = auVar19._8_4_ * auVar68._8_4_;
  auVar139._12_4_ = auVar19._12_4_ * auVar68._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar68 = vpmovsxwd_avx(auVar18);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar120._0_4_ = auVar19._0_4_ * auVar68._0_4_;
  auVar120._4_4_ = auVar19._4_4_ * auVar68._4_4_;
  auVar120._8_4_ = auVar19._8_4_ * auVar68._8_4_;
  auVar120._12_4_ = auVar19._12_4_ * auVar68._12_4_;
  auVar68 = vpminsd_avx(auVar157,auVar146);
  auVar66 = vpminsd_avx(auVar153,auVar124);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66 = vpminsd_avx(auVar139,auVar120);
  uVar118 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar19._4_4_ = uVar118;
  auVar19._0_4_ = uVar118;
  auVar19._8_4_ = uVar118;
  auVar19._12_4_ = uVar118;
  auVar66 = vmaxps_avx512vl(auVar66,auVar19);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar68,auVar20);
  auVar68 = vpmaxsd_avx(auVar157,auVar146);
  auVar66 = vpmaxsd_avx(auVar153,auVar124);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar66 = vpmaxsd_avx(auVar139,auVar120);
  fVar156 = ray->tfar;
  auVar69._4_4_ = fVar156;
  auVar69._0_4_ = fVar156;
  auVar69._8_4_ = fVar156;
  auVar69._12_4_ = fVar156;
  auVar66 = vminps_avx512vl(auVar66,auVar69);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar70._8_4_ = 0x3f800003;
  auVar70._0_8_ = 0x3f8000033f800003;
  auVar70._12_4_ = 0x3f800003;
  auVar68 = vmulps_avx512vl(auVar68,auVar70);
  uVar129 = vcmpps_avx512vl(local_270,auVar68,2);
  uVar21 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  local_368 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),(uint)((byte)uVar129 & 0xf & (byte)uVar21));
  local_538 = ray;
  local_540 = prim;
  while (local_368 != 0) {
    lVar62 = 0;
    for (uVar58 = local_368; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      lVar62 = lVar62 + 1;
    }
    local_530 = (ulong)*(uint *)(local_540 + 2);
    pGVar9 = (context->scene->geometries).items[*(uint *)(local_540 + 2)].ptr;
    local_488 = (ulong)*(uint *)(local_540 + lVar62 * 4 + 6);
    uVar58 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(local_540 + lVar62 * 4 + 6));
    p_Var10 = pGVar9[1].intersectionFilterN;
    lVar62 = *(long *)&pGVar9[1].time_range.upper;
    local_3d0 = *(undefined1 (*) [16])(lVar62 + (long)p_Var10 * uVar58);
    local_3e0 = *(undefined1 (*) [16])(lVar62 + (uVar58 + 1) * (long)p_Var10);
    pauVar3 = (undefined1 (*) [16])(lVar62 + (uVar58 + 2) * (long)p_Var10);
    auVar68 = *pauVar3;
    local_510 = *(undefined8 *)*pauVar3;
    uStack_508 = *(undefined8 *)(*pauVar3 + 8);
    uVar61 = local_368 - 1 & local_368;
    pauVar4 = (undefined1 (*) [12])(lVar62 + (uVar58 + 3) * (long)p_Var10);
    local_380 = (float)*(undefined8 *)*pauVar4;
    fStack_37c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_378 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_374 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar61 != 0) {
      uVar59 = uVar61 - 1 & uVar61;
      for (uVar58 = uVar61; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
      if (uVar59 != 0) {
        for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (local_538->org).field_0;
    auVar67 = vsubps_avx512vl(local_3d0,(undefined1  [16])aVar5);
    uVar118 = auVar67._0_4_;
    auVar125._4_4_ = uVar118;
    auVar125._0_4_ = uVar118;
    auVar125._8_4_ = uVar118;
    auVar125._12_4_ = uVar118;
    auVar66 = vshufps_avx(auVar67,auVar67,0x55);
    aVar6 = (local_520->ray_space).vx.field_0;
    aVar7 = (local_520->ray_space).vy.field_0;
    fVar156 = (local_520->ray_space).vz.field_0.m128[0];
    fVar128 = (local_520->ray_space).vz.field_0.m128[1];
    fVar135 = (local_520->ray_space).vz.field_0.m128[2];
    fVar136 = (local_520->ray_space).vz.field_0.m128[3];
    auVar67 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar170._0_4_ = auVar67._0_4_ * fVar156;
    auVar170._4_4_ = auVar67._4_4_ * fVar128;
    auVar170._8_4_ = auVar67._8_4_ * fVar135;
    auVar170._12_4_ = auVar67._12_4_ * fVar136;
    auVar66 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar7,auVar66);
    auVar17 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar6,auVar125);
    auVar69 = vshufps_avx512vl(local_3d0,local_3d0,0xff);
    auVar67 = vsubps_avx(local_3e0,(undefined1  [16])aVar5);
    uVar118 = auVar67._0_4_;
    auVar132._4_4_ = uVar118;
    auVar132._0_4_ = uVar118;
    auVar132._8_4_ = uVar118;
    auVar132._12_4_ = uVar118;
    auVar66 = vshufps_avx(auVar67,auVar67,0x55);
    auVar67 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar171._0_4_ = auVar67._0_4_ * fVar156;
    auVar171._4_4_ = auVar67._4_4_ * fVar128;
    auVar171._8_4_ = auVar67._8_4_ * fVar135;
    auVar171._12_4_ = auVar67._12_4_ * fVar136;
    auVar66 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar66);
    auVar18 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar6,auVar132);
    auVar66 = vshufps_avx(local_3e0,local_3e0,0xff);
    auVar121 = vsubps_avx(auVar68,(undefined1  [16])aVar5);
    uVar118 = auVar121._0_4_;
    auVar158._4_4_ = uVar118;
    auVar158._0_4_ = uVar118;
    auVar158._8_4_ = uVar118;
    auVar158._12_4_ = uVar118;
    auVar67 = vshufps_avx(auVar121,auVar121,0x55);
    auVar121 = vshufps_avx(auVar121,auVar121,0xaa);
    auVar173._0_4_ = auVar121._0_4_ * fVar156;
    auVar173._4_4_ = auVar121._4_4_ * fVar128;
    auVar173._8_4_ = auVar121._8_4_ * fVar135;
    auVar173._12_4_ = auVar121._12_4_ * fVar136;
    auVar67 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar67);
    auVar121 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar6,auVar158);
    auVar70 = vshufps_avx512vl(auVar68,auVar68,0xff);
    auVar54._12_4_ = fStack_374;
    auVar54._0_12_ = *pauVar4;
    local_2e0 = ZEXT1632((undefined1  [16])aVar5);
    auVar67 = vsubps_avx(auVar54,(undefined1  [16])aVar5);
    uVar118 = auVar67._0_4_;
    auVar159._4_4_ = uVar118;
    auVar159._0_4_ = uVar118;
    auVar159._8_4_ = uVar118;
    auVar159._12_4_ = uVar118;
    auVar68 = vshufps_avx(auVar67,auVar67,0x55);
    auVar67 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar174._0_4_ = auVar67._0_4_ * fVar156;
    auVar174._4_4_ = auVar67._4_4_ * fVar128;
    auVar174._8_4_ = auVar67._8_4_ * fVar135;
    auVar174._12_4_ = auVar67._12_4_ * fVar136;
    auVar68 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar68);
    auVar67 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar6,auVar159);
    local_548 = (long)iVar8;
    lVar62 = local_548 * 0x44;
    auVar86 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62);
    uVar118 = auVar17._0_4_;
    local_340._4_4_ = uVar118;
    local_340._0_4_ = uVar118;
    local_340._8_4_ = uVar118;
    local_340._12_4_ = uVar118;
    local_340._16_4_ = uVar118;
    local_340._20_4_ = uVar118;
    local_340._24_4_ = uVar118;
    local_340._28_4_ = uVar118;
    auVar72._8_4_ = 1;
    auVar72._0_8_ = 0x100000001;
    auVar72._12_4_ = 1;
    auVar72._16_4_ = 1;
    auVar72._20_4_ = 1;
    auVar72._24_4_ = 1;
    auVar72._28_4_ = 1;
    local_360 = vpermps_avx2(auVar72,ZEXT1632(auVar17));
    auVar87 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x484);
    local_420 = vbroadcastss_avx512vl(auVar18);
    local_3a0 = vpermps_avx512vl(auVar72,ZEXT1632(auVar18));
    auVar85 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x908);
    local_440 = vbroadcastss_avx512vl(auVar121);
    local_460 = vpermps_avx512vl(auVar72,ZEXT1632(auVar121));
    auVar84 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0xd8c);
    fVar156 = auVar67._0_4_;
    local_3c0._4_4_ = fVar156;
    local_3c0._0_4_ = fVar156;
    local_3c0._8_4_ = fVar156;
    local_3c0._12_4_ = fVar156;
    local_3c0._16_4_ = fVar156;
    local_3c0._20_4_ = fVar156;
    local_3c0._24_4_ = fVar156;
    local_3c0._28_4_ = fVar156;
    local_480 = vpermps_avx512vl(auVar72,ZEXT1632(auVar67));
    auVar72 = vmulps_avx512vl(local_3c0,auVar84);
    auVar73 = vmulps_avx512vl(local_480,auVar84);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar85,local_440);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar85,local_460);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar87,local_420);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar87,local_3a0);
    auVar74 = vfmadd231ps_avx512vl(auVar72,auVar86,local_340);
    auVar75 = vfmadd231ps_avx512vl(auVar73,auVar86,local_360);
    auVar72 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62);
    auVar73 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x484);
    auVar83 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x908);
    auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0xd8c);
    auVar76 = vmulps_avx512vl(local_3c0,auVar82);
    auVar77 = vmulps_avx512vl(local_480,auVar82);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar83,local_440);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar83,local_460);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar73,local_420);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar73,local_3a0);
    auVar19 = vfmadd231ps_fma(auVar76,auVar72,local_340);
    auVar20 = vfmadd231ps_fma(auVar77,auVar72,local_360);
    auVar76 = vsubps_avx512vl(ZEXT1632(auVar19),auVar74);
    auVar77 = vsubps_avx512vl(ZEXT1632(auVar20),auVar75);
    auVar78 = vmulps_avx512vl(auVar75,auVar76);
    auVar79 = vmulps_avx512vl(auVar74,auVar77);
    auVar78 = vsubps_avx512vl(auVar78,auVar79);
    auVar68 = vshufps_avx512vl(auVar54,auVar54,0xff);
    local_80 = vbroadcastsd_avx512vl(auVar69);
    uVar129 = auVar66._0_8_;
    local_a0._8_8_ = uVar129;
    local_a0._0_8_ = uVar129;
    local_a0._16_8_ = uVar129;
    local_a0._24_8_ = uVar129;
    local_c0 = vbroadcastsd_avx512vl(auVar70);
    _local_e0 = vbroadcastsd_avx512vl(auVar68);
    auVar79 = vmulps_avx512vl(_local_e0,auVar84);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar85,local_c0);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar87,local_a0);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar86,local_80);
    auVar80 = vmulps_avx512vl(_local_e0,auVar82);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,local_c0);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar73,local_a0);
    auVar69 = vfmadd231ps_fma(auVar80,auVar72,local_80);
    auVar80 = vmulps_avx512vl(auVar77,auVar77);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar76,auVar76);
    auVar81 = vmaxps_avx512vl(auVar79,ZEXT1632(auVar69));
    auVar81 = vmulps_avx512vl(auVar81,auVar81);
    auVar80 = vmulps_avx512vl(auVar81,auVar80);
    auVar78 = vmulps_avx512vl(auVar78,auVar78);
    uVar129 = vcmpps_avx512vl(auVar78,auVar80,2);
    auVar68 = vblendps_avx(auVar17,local_3d0,8);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar66 = vandps_avx512vl(auVar68,auVar70);
    auVar68 = vblendps_avx(auVar18,local_3e0,8);
    auVar68 = vandps_avx512vl(auVar68,auVar70);
    auVar66 = vmaxps_avx(auVar66,auVar68);
    auVar68 = vblendps_avx(auVar121,*pauVar3,8);
    auVar71 = vandps_avx512vl(auVar68,auVar70);
    auVar68 = vblendps_avx(auVar67,auVar54,8);
    auVar68 = vandps_avx512vl(auVar68,auVar70);
    auVar68 = vmaxps_avx(auVar71,auVar68);
    auVar68 = vmaxps_avx(auVar66,auVar68);
    auVar66 = vmovshdup_avx(auVar68);
    auVar66 = vmaxss_avx(auVar66,auVar68);
    auVar68 = vshufpd_avx(auVar68,auVar68,1);
    auVar68 = vmaxss_avx(auVar68,auVar66);
    _local_300 = vcvtsi2ss_avx512f(local_3d0,iVar8);
    auVar80._0_4_ = local_300._0_4_;
    auVar80._4_4_ = auVar80._0_4_;
    auVar80._8_4_ = auVar80._0_4_;
    auVar80._12_4_ = auVar80._0_4_;
    auVar80._16_4_ = auVar80._0_4_;
    auVar80._20_4_ = auVar80._0_4_;
    auVar80._24_4_ = auVar80._0_4_;
    auVar80._28_4_ = auVar80._0_4_;
    uVar21 = vcmpps_avx512vl(auVar80,_DAT_01f7b060,0xe);
    bVar63 = (byte)uVar129 & (byte)uVar21;
    auVar68 = vmulss_avx512f(auVar68,ZEXT416(0x35000000));
    auVar78._8_4_ = 2;
    auVar78._0_8_ = 0x200000002;
    auVar78._12_4_ = 2;
    auVar78._16_4_ = 2;
    auVar78._20_4_ = 2;
    auVar78._24_4_ = 2;
    auVar78._28_4_ = 2;
    local_320 = vpermps_avx2(auVar78,ZEXT1632(auVar17));
    local_100 = vpermps_avx512vl(auVar78,ZEXT1632(auVar18));
    local_120 = vpermps_avx512vl(auVar78,ZEXT1632(auVar121));
    local_140 = vpermps_avx512vl(auVar78,ZEXT1632(auVar67));
    auVar66 = auVar82._0_16_;
    if (bVar63 == 0) {
      bVar60 = false;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar180 = ZEXT3264(auVar86);
      auVar66 = vxorps_avx512vl(auVar66,auVar66);
      auVar181 = ZEXT1664(auVar66);
      auVar182 = ZEXT3264(local_340);
      auVar184 = ZEXT3264(local_360);
      auVar186 = ZEXT3264(local_420);
      auVar185 = ZEXT3264(local_3a0);
      auVar183 = ZEXT3264(local_440);
      auVar188 = ZEXT3264(local_460);
      auVar179 = ZEXT3264(local_3c0);
      auVar187 = ZEXT3264(local_480);
    }
    else {
      auVar82 = vmulps_avx512vl(local_140,auVar82);
      auVar83 = vfmadd213ps_avx512vl(auVar83,local_120,auVar82);
      auVar73 = vfmadd213ps_avx512vl(auVar73,local_100,auVar83);
      auVar78 = vfmadd213ps_avx512vl(auVar72,local_320,auVar73);
      auVar84 = vmulps_avx512vl(local_140,auVar84);
      auVar85 = vfmadd213ps_avx512vl(auVar85,local_120,auVar84);
      auVar73 = vfmadd213ps_avx512vl(auVar87,local_100,auVar85);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x1210);
      auVar85 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x1694);
      auVar84 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x1b18);
      auVar72 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 + 0x1f9c);
      auVar81 = vfmadd213ps_avx512vl(auVar86,local_320,auVar73);
      auVar86 = vmulps_avx512vl(local_3c0,auVar72);
      auVar73 = vmulps_avx512vl(local_480,auVar72);
      auVar72 = vmulps_avx512vl(local_140,auVar72);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,local_440);
      auVar67 = vfmadd231ps_fma(auVar73,auVar84,local_460);
      auVar84 = vfmadd231ps_avx512vl(auVar72,local_120,auVar84);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar85,local_420);
      auVar72 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar85,local_3a0);
      auVar73 = vfmadd231ps_avx512vl(auVar84,local_100,auVar85);
      auVar83 = vfmadd231ps_avx512vl(auVar86,auVar87,local_340);
      auVar72 = vfmadd231ps_avx512vl(auVar72,auVar87,local_360);
      auVar86 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x1210);
      auVar85 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x1b18);
      auVar84 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x1f9c);
      auVar67 = vfmadd231ps_fma(auVar73,local_320,auVar87);
      auVar73._4_4_ = fVar156 * auVar84._4_4_;
      auVar73._0_4_ = fVar156 * auVar84._0_4_;
      auVar73._8_4_ = fVar156 * auVar84._8_4_;
      auVar73._12_4_ = fVar156 * auVar84._12_4_;
      auVar73._16_4_ = fVar156 * auVar84._16_4_;
      auVar73._20_4_ = fVar156 * auVar84._20_4_;
      auVar73._24_4_ = fVar156 * auVar84._24_4_;
      auVar73._28_4_ = auVar87._28_4_;
      auVar87 = vmulps_avx512vl(local_480,auVar84);
      auVar84 = vmulps_avx512vl(local_140,auVar84);
      auVar73 = vfmadd231ps_avx512vl(auVar73,auVar85,local_440);
      auVar121 = vfmadd231ps_fma(auVar87,auVar85,local_460);
      auVar85 = vfmadd231ps_avx512vl(auVar84,local_120,auVar85);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 + 0x1694);
      auVar84 = vfmadd231ps_avx512vl(auVar73,auVar87,local_420);
      auVar73 = vfmadd231ps_avx512vl(ZEXT1632(auVar121),auVar87,local_3a0);
      auVar87 = vfmadd231ps_avx512vl(auVar85,local_100,auVar87);
      auVar85 = vfmadd231ps_avx512vl(auVar84,auVar86,local_340);
      auVar84 = vfmadd231ps_avx512vl(auVar73,auVar86,local_360);
      auVar121 = vfmadd231ps_fma(auVar87,local_320,auVar86);
      auVar177._8_4_ = 0x7fffffff;
      auVar177._0_8_ = 0x7fffffff7fffffff;
      auVar177._12_4_ = 0x7fffffff;
      auVar177._16_4_ = 0x7fffffff;
      auVar177._20_4_ = 0x7fffffff;
      auVar177._24_4_ = 0x7fffffff;
      auVar177._28_4_ = 0x7fffffff;
      auVar86 = vandps_avx(auVar83,auVar177);
      auVar87 = vandps_avx(auVar72,auVar177);
      auVar87 = vmaxps_avx(auVar86,auVar87);
      auVar86 = vandps_avx(ZEXT1632(auVar67),auVar177);
      auVar86 = vmaxps_avx(auVar87,auVar86);
      auVar73 = vbroadcastss_avx512vl(auVar68);
      uVar58 = vcmpps_avx512vl(auVar86,auVar73,1);
      bVar60 = (bool)((byte)uVar58 & 1);
      auVar101._0_4_ = (float)((uint)bVar60 * auVar76._0_4_ | (uint)!bVar60 * auVar83._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar60 * auVar76._4_4_ | (uint)!bVar60 * auVar83._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar60 * auVar76._8_4_ | (uint)!bVar60 * auVar83._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar60 * auVar76._12_4_ | (uint)!bVar60 * auVar83._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar60 * auVar76._16_4_ | (uint)!bVar60 * auVar83._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar60 * auVar76._20_4_ | (uint)!bVar60 * auVar83._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar60 * auVar76._24_4_ | (uint)!bVar60 * auVar83._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar101._28_4_ = (uint)bVar60 * auVar76._28_4_ | (uint)!bVar60 * auVar83._28_4_;
      bVar60 = (bool)((byte)uVar58 & 1);
      auVar88._0_4_ = (float)((uint)bVar60 * auVar77._0_4_ | (uint)!bVar60 * auVar72._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar88._4_4_ = (float)((uint)bVar60 * auVar77._4_4_ | (uint)!bVar60 * auVar72._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar88._8_4_ = (float)((uint)bVar60 * auVar77._8_4_ | (uint)!bVar60 * auVar72._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar88._12_4_ = (float)((uint)bVar60 * auVar77._12_4_ | (uint)!bVar60 * auVar72._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar88._16_4_ = (float)((uint)bVar60 * auVar77._16_4_ | (uint)!bVar60 * auVar72._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar88._20_4_ = (float)((uint)bVar60 * auVar77._20_4_ | (uint)!bVar60 * auVar72._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar88._24_4_ = (float)((uint)bVar60 * auVar77._24_4_ | (uint)!bVar60 * auVar72._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar88._28_4_ = (uint)bVar60 * auVar77._28_4_ | (uint)!bVar60 * auVar72._28_4_;
      auVar86 = vandps_avx(auVar177,auVar85);
      auVar87 = vandps_avx(auVar84,auVar177);
      auVar87 = vmaxps_avx(auVar86,auVar87);
      auVar86 = vandps_avx(ZEXT1632(auVar121),auVar177);
      auVar86 = vmaxps_avx(auVar87,auVar86);
      uVar58 = vcmpps_avx512vl(auVar86,auVar73,1);
      bVar60 = (bool)((byte)uVar58 & 1);
      auVar89._0_4_ = (float)((uint)bVar60 * auVar76._0_4_ | (uint)!bVar60 * auVar85._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar89._4_4_ = (float)((uint)bVar60 * auVar76._4_4_ | (uint)!bVar60 * auVar85._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar89._8_4_ = (float)((uint)bVar60 * auVar76._8_4_ | (uint)!bVar60 * auVar85._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar89._12_4_ = (float)((uint)bVar60 * auVar76._12_4_ | (uint)!bVar60 * auVar85._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar89._16_4_ = (float)((uint)bVar60 * auVar76._16_4_ | (uint)!bVar60 * auVar85._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar89._20_4_ = (float)((uint)bVar60 * auVar76._20_4_ | (uint)!bVar60 * auVar85._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar89._24_4_ = (float)((uint)bVar60 * auVar76._24_4_ | (uint)!bVar60 * auVar85._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar89._28_4_ = (uint)bVar60 * auVar76._28_4_ | (uint)!bVar60 * auVar85._28_4_;
      bVar60 = (bool)((byte)uVar58 & 1);
      auVar90._0_4_ = (float)((uint)bVar60 * auVar77._0_4_ | (uint)!bVar60 * auVar84._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar90._4_4_ = (float)((uint)bVar60 * auVar77._4_4_ | (uint)!bVar60 * auVar84._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar90._8_4_ = (float)((uint)bVar60 * auVar77._8_4_ | (uint)!bVar60 * auVar84._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar90._12_4_ = (float)((uint)bVar60 * auVar77._12_4_ | (uint)!bVar60 * auVar84._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar90._16_4_ = (float)((uint)bVar60 * auVar77._16_4_ | (uint)!bVar60 * auVar84._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar90._20_4_ = (float)((uint)bVar60 * auVar77._20_4_ | (uint)!bVar60 * auVar84._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar90._24_4_ = (float)((uint)bVar60 * auVar77._24_4_ | (uint)!bVar60 * auVar84._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar90._28_4_ = (uint)bVar60 * auVar77._28_4_ | (uint)!bVar60 * auVar84._28_4_;
      auVar70 = vxorps_avx512vl(auVar66,auVar66);
      auVar181 = ZEXT1664(auVar70);
      auVar86 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar70));
      auVar66 = vfmadd231ps_fma(auVar86,auVar88,auVar88);
      auVar85 = vrsqrt14ps_avx512vl(ZEXT1632(auVar66));
      fVar156 = auVar85._0_4_;
      fVar128 = auVar85._4_4_;
      fVar135 = auVar85._8_4_;
      fVar136 = auVar85._12_4_;
      fVar137 = auVar85._16_4_;
      fVar160 = auVar85._20_4_;
      fVar161 = auVar85._24_4_;
      auVar86._4_4_ = fVar128 * fVar128 * fVar128 * auVar66._4_4_ * -0.5;
      auVar86._0_4_ = fVar156 * fVar156 * fVar156 * auVar66._0_4_ * -0.5;
      auVar86._8_4_ = fVar135 * fVar135 * fVar135 * auVar66._8_4_ * -0.5;
      auVar86._12_4_ = fVar136 * fVar136 * fVar136 * auVar66._12_4_ * -0.5;
      auVar86._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar86._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar86._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar86._28_4_ = 0;
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar72,auVar85);
      auVar87._4_4_ = auVar88._4_4_ * auVar86._4_4_;
      auVar87._0_4_ = auVar88._0_4_ * auVar86._0_4_;
      auVar87._8_4_ = auVar88._8_4_ * auVar86._8_4_;
      auVar87._12_4_ = auVar88._12_4_ * auVar86._12_4_;
      auVar87._16_4_ = auVar88._16_4_ * auVar86._16_4_;
      auVar87._20_4_ = auVar88._20_4_ * auVar86._20_4_;
      auVar87._24_4_ = auVar88._24_4_ * auVar86._24_4_;
      auVar87._28_4_ = auVar85._28_4_;
      auVar85._4_4_ = auVar86._4_4_ * -auVar101._4_4_;
      auVar85._0_4_ = auVar86._0_4_ * -auVar101._0_4_;
      auVar85._8_4_ = auVar86._8_4_ * -auVar101._8_4_;
      auVar85._12_4_ = auVar86._12_4_ * -auVar101._12_4_;
      auVar85._16_4_ = auVar86._16_4_ * -auVar101._16_4_;
      auVar85._20_4_ = auVar86._20_4_ * -auVar101._20_4_;
      auVar85._24_4_ = auVar86._24_4_ * -auVar101._24_4_;
      auVar85._28_4_ = auVar101._28_4_ ^ 0x80000000;
      auVar73 = vmulps_avx512vl(auVar86,ZEXT1632(auVar70));
      auVar101 = ZEXT1632(auVar70);
      auVar84 = vfmadd213ps_avx512vl(auVar89,auVar89,auVar101);
      auVar66 = vfmadd231ps_fma(auVar84,auVar90,auVar90);
      auVar82 = vrsqrt14ps_avx512vl(ZEXT1632(auVar66));
      fVar156 = auVar82._0_4_;
      fVar128 = auVar82._4_4_;
      fVar135 = auVar82._8_4_;
      fVar136 = auVar82._12_4_;
      fVar137 = auVar82._16_4_;
      fVar160 = auVar82._20_4_;
      fVar161 = auVar82._24_4_;
      auVar84._4_4_ = fVar128 * fVar128 * fVar128 * auVar66._4_4_ * -0.5;
      auVar84._0_4_ = fVar156 * fVar156 * fVar156 * auVar66._0_4_ * -0.5;
      auVar84._8_4_ = fVar135 * fVar135 * fVar135 * auVar66._8_4_ * -0.5;
      auVar84._12_4_ = fVar136 * fVar136 * fVar136 * auVar66._12_4_ * -0.5;
      auVar84._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar84._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar84._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar84._28_4_ = 0;
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar72,auVar82);
      auVar83._4_4_ = auVar90._4_4_ * auVar84._4_4_;
      auVar83._0_4_ = auVar90._0_4_ * auVar84._0_4_;
      auVar83._8_4_ = auVar90._8_4_ * auVar84._8_4_;
      auVar83._12_4_ = auVar90._12_4_ * auVar84._12_4_;
      auVar83._16_4_ = auVar90._16_4_ * auVar84._16_4_;
      auVar83._20_4_ = auVar90._20_4_ * auVar84._20_4_;
      auVar83._24_4_ = auVar90._24_4_ * auVar84._24_4_;
      auVar83._28_4_ = auVar82._28_4_;
      auVar82._4_4_ = -auVar89._4_4_ * auVar84._4_4_;
      auVar82._0_4_ = -auVar89._0_4_ * auVar84._0_4_;
      auVar82._8_4_ = -auVar89._8_4_ * auVar84._8_4_;
      auVar82._12_4_ = -auVar89._12_4_ * auVar84._12_4_;
      auVar82._16_4_ = -auVar89._16_4_ * auVar84._16_4_;
      auVar82._20_4_ = -auVar89._20_4_ * auVar84._20_4_;
      auVar82._24_4_ = -auVar89._24_4_ * auVar84._24_4_;
      auVar82._28_4_ = auVar86._28_4_;
      auVar86 = vmulps_avx512vl(auVar84,auVar101);
      auVar84 = vfmadd213ps_avx512vl(auVar87,auVar79,auVar74);
      auVar72 = vfmadd213ps_avx512vl(auVar85,auVar79,auVar75);
      auVar76 = vfmadd213ps_avx512vl(auVar73,auVar79,auVar81);
      auVar77 = vfmadd213ps_avx512vl(auVar83,ZEXT1632(auVar69),ZEXT1632(auVar19));
      auVar87 = vfnmadd213ps_avx512vl(auVar87,auVar79,auVar74);
      auVar74 = ZEXT1632(auVar69);
      auVar66 = vfmadd213ps_fma(auVar82,auVar74,ZEXT1632(auVar20));
      auVar85 = vfnmadd213ps_avx512vl(auVar85,auVar79,auVar75);
      auVar67 = vfmadd213ps_fma(auVar86,auVar74,auVar78);
      auVar73 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar73);
      auVar18 = vfnmadd213ps_fma(auVar83,auVar74,ZEXT1632(auVar19));
      auVar19 = vfnmadd213ps_fma(auVar82,auVar74,ZEXT1632(auVar20));
      auVar20 = vfnmadd231ps_fma(auVar78,ZEXT1632(auVar69),auVar86);
      auVar83 = vsubps_avx512vl(auVar77,auVar87);
      auVar86 = vsubps_avx(ZEXT1632(auVar66),auVar85);
      auVar82 = vsubps_avx512vl(ZEXT1632(auVar67),auVar73);
      auVar74 = vmulps_avx512vl(auVar86,auVar73);
      auVar121 = vfmsub231ps_fma(auVar74,auVar85,auVar82);
      auVar74._4_4_ = auVar87._4_4_ * auVar82._4_4_;
      auVar74._0_4_ = auVar87._0_4_ * auVar82._0_4_;
      auVar74._8_4_ = auVar87._8_4_ * auVar82._8_4_;
      auVar74._12_4_ = auVar87._12_4_ * auVar82._12_4_;
      auVar74._16_4_ = auVar87._16_4_ * auVar82._16_4_;
      auVar74._20_4_ = auVar87._20_4_ * auVar82._20_4_;
      auVar74._24_4_ = auVar87._24_4_ * auVar82._24_4_;
      auVar74._28_4_ = auVar82._28_4_;
      auVar82 = vfmsub231ps_avx512vl(auVar74,auVar73,auVar83);
      auVar75._4_4_ = auVar85._4_4_ * auVar83._4_4_;
      auVar75._0_4_ = auVar85._0_4_ * auVar83._0_4_;
      auVar75._8_4_ = auVar85._8_4_ * auVar83._8_4_;
      auVar75._12_4_ = auVar85._12_4_ * auVar83._12_4_;
      auVar75._16_4_ = auVar85._16_4_ * auVar83._16_4_;
      auVar75._20_4_ = auVar85._20_4_ * auVar83._20_4_;
      auVar75._24_4_ = auVar85._24_4_ * auVar83._24_4_;
      auVar75._28_4_ = auVar83._28_4_;
      auVar17 = vfmsub231ps_fma(auVar75,auVar87,auVar86);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar17),auVar101,auVar82);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar101,ZEXT1632(auVar121));
      auVar75 = ZEXT1632(auVar70);
      uVar58 = vcmpps_avx512vl(auVar86,auVar75,2);
      bVar55 = (byte)uVar58;
      auVar91._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar18._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar91._4_4_ = (float)((uint)bVar60 * auVar84._4_4_ | (uint)!bVar60 * auVar18._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar91._8_4_ = (float)((uint)bVar60 * auVar84._8_4_ | (uint)!bVar60 * auVar18._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar91._12_4_ = (float)((uint)bVar60 * auVar84._12_4_ | (uint)!bVar60 * auVar18._12_4_);
      fVar128 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar84._16_4_);
      auVar91._16_4_ = fVar128;
      fVar156 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar84._20_4_);
      auVar91._20_4_ = fVar156;
      fVar135 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar84._24_4_);
      auVar91._24_4_ = fVar135;
      auVar91._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar84._28_4_;
      auVar92._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar19._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar92._4_4_ = (float)((uint)bVar60 * auVar72._4_4_ | (uint)!bVar60 * auVar19._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar92._8_4_ = (float)((uint)bVar60 * auVar72._8_4_ | (uint)!bVar60 * auVar19._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar92._12_4_ = (float)((uint)bVar60 * auVar72._12_4_ | (uint)!bVar60 * auVar19._12_4_);
      fVar136 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar72._16_4_);
      auVar92._16_4_ = fVar136;
      fVar137 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar72._20_4_);
      auVar92._20_4_ = fVar137;
      fVar160 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar72._24_4_);
      auVar92._24_4_ = fVar160;
      auVar92._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar72._28_4_;
      auVar93._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar20._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar93._4_4_ = (float)((uint)bVar60 * auVar76._4_4_ | (uint)!bVar60 * auVar20._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar93._8_4_ = (float)((uint)bVar60 * auVar76._8_4_ | (uint)!bVar60 * auVar20._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar93._12_4_ = (float)((uint)bVar60 * auVar76._12_4_ | (uint)!bVar60 * auVar20._12_4_);
      fVar163 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar76._16_4_);
      auVar93._16_4_ = fVar163;
      fVar162 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar76._20_4_);
      auVar93._20_4_ = fVar162;
      fVar161 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar76._24_4_);
      auVar93._24_4_ = fVar161;
      iVar1 = (uint)(byte)(uVar58 >> 7) * auVar76._28_4_;
      auVar93._28_4_ = iVar1;
      auVar84 = vblendmps_avx512vl(auVar87,auVar77);
      auVar94._0_4_ =
           (uint)(bVar55 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar121._0_4_;
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar94._4_4_ = (uint)bVar60 * auVar84._4_4_ | (uint)!bVar60 * auVar121._4_4_;
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar94._8_4_ = (uint)bVar60 * auVar84._8_4_ | (uint)!bVar60 * auVar121._8_4_;
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar94._12_4_ = (uint)bVar60 * auVar84._12_4_ | (uint)!bVar60 * auVar121._12_4_;
      auVar94._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar84._16_4_;
      auVar94._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar84._20_4_;
      auVar94._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar84._24_4_;
      auVar94._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar84._28_4_;
      auVar84 = vblendmps_avx512vl(auVar85,ZEXT1632(auVar66));
      auVar95._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar72._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar95._4_4_ = (float)((uint)bVar60 * auVar84._4_4_ | (uint)!bVar60 * auVar72._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar95._8_4_ = (float)((uint)bVar60 * auVar84._8_4_ | (uint)!bVar60 * auVar72._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar95._12_4_ = (float)((uint)bVar60 * auVar84._12_4_ | (uint)!bVar60 * auVar72._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar95._16_4_ = (float)((uint)bVar60 * auVar84._16_4_ | (uint)!bVar60 * auVar72._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar95._20_4_ = (float)((uint)bVar60 * auVar84._20_4_ | (uint)!bVar60 * auVar72._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar95._24_4_ = (float)((uint)bVar60 * auVar84._24_4_ | (uint)!bVar60 * auVar72._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar95._28_4_ = (uint)bVar60 * auVar84._28_4_ | (uint)!bVar60 * auVar72._28_4_;
      auVar84 = vblendmps_avx512vl(auVar73,ZEXT1632(auVar67));
      auVar96._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar76._0_4_);
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar96._4_4_ = (float)((uint)bVar60 * auVar84._4_4_ | (uint)!bVar60 * auVar76._4_4_);
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar96._8_4_ = (float)((uint)bVar60 * auVar84._8_4_ | (uint)!bVar60 * auVar76._8_4_);
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar96._12_4_ = (float)((uint)bVar60 * auVar84._12_4_ | (uint)!bVar60 * auVar76._12_4_);
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar96._16_4_ = (float)((uint)bVar60 * auVar84._16_4_ | (uint)!bVar60 * auVar76._16_4_);
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar96._20_4_ = (float)((uint)bVar60 * auVar84._20_4_ | (uint)!bVar60 * auVar76._20_4_);
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar96._24_4_ = (float)((uint)bVar60 * auVar84._24_4_ | (uint)!bVar60 * auVar76._24_4_);
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar96._28_4_ = (uint)bVar60 * auVar84._28_4_ | (uint)!bVar60 * auVar76._28_4_;
      auVar97._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar77._0_4_;
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar97._4_4_ = (uint)bVar60 * (int)auVar87._4_4_ | (uint)!bVar60 * auVar77._4_4_;
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar97._8_4_ = (uint)bVar60 * (int)auVar87._8_4_ | (uint)!bVar60 * auVar77._8_4_;
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar97._12_4_ = (uint)bVar60 * (int)auVar87._12_4_ | (uint)!bVar60 * auVar77._12_4_;
      bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar97._16_4_ = (uint)bVar60 * (int)auVar87._16_4_ | (uint)!bVar60 * auVar77._16_4_;
      bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar97._20_4_ = (uint)bVar60 * (int)auVar87._20_4_ | (uint)!bVar60 * auVar77._20_4_;
      bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar97._24_4_ = (uint)bVar60 * (int)auVar87._24_4_ | (uint)!bVar60 * auVar77._24_4_;
      bVar60 = SUB81(uVar58 >> 7,0);
      auVar97._28_4_ = (uint)bVar60 * auVar87._28_4_ | (uint)!bVar60 * auVar77._28_4_;
      auVar98._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar66._0_4_;
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar98._4_4_ = (uint)bVar60 * (int)auVar85._4_4_ | (uint)!bVar60 * auVar66._4_4_;
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar98._8_4_ = (uint)bVar60 * (int)auVar85._8_4_ | (uint)!bVar60 * auVar66._8_4_;
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar98._12_4_ = (uint)bVar60 * (int)auVar85._12_4_ | (uint)!bVar60 * auVar66._12_4_;
      auVar98._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * (int)auVar85._16_4_;
      auVar98._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * (int)auVar85._20_4_;
      auVar98._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * (int)auVar85._24_4_;
      auVar98._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar85._28_4_;
      auVar99._0_4_ = (uint)(bVar55 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar67._0_4_
      ;
      bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar60 * auVar73._4_4_ | (uint)!bVar60 * auVar67._4_4_;
      bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar60 * auVar73._8_4_ | (uint)!bVar60 * auVar67._8_4_;
      bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar99._12_4_ = (uint)bVar60 * auVar73._12_4_ | (uint)!bVar60 * auVar67._12_4_;
      auVar99._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar73._16_4_;
      auVar99._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar73._20_4_;
      auVar99._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar73._24_4_;
      iVar2 = (uint)(byte)(uVar58 >> 7) * auVar73._28_4_;
      auVar99._28_4_ = iVar2;
      auVar83 = vsubps_avx512vl(auVar97,auVar91);
      auVar87 = vsubps_avx(auVar98,auVar92);
      auVar85 = vsubps_avx(auVar99,auVar93);
      auVar84 = vsubps_avx(auVar91,auVar94);
      auVar72 = vsubps_avx(auVar92,auVar95);
      auVar73 = vsubps_avx(auVar93,auVar96);
      auVar76._4_4_ = auVar85._4_4_ * auVar91._4_4_;
      auVar76._0_4_ = auVar85._0_4_ * auVar91._0_4_;
      auVar76._8_4_ = auVar85._8_4_ * auVar91._8_4_;
      auVar76._12_4_ = auVar85._12_4_ * auVar91._12_4_;
      auVar76._16_4_ = auVar85._16_4_ * fVar128;
      auVar76._20_4_ = auVar85._20_4_ * fVar156;
      auVar76._24_4_ = auVar85._24_4_ * fVar135;
      auVar76._28_4_ = iVar2;
      auVar66 = vfmsub231ps_fma(auVar76,auVar93,auVar83);
      auVar77._4_4_ = auVar92._4_4_ * auVar83._4_4_;
      auVar77._0_4_ = auVar92._0_4_ * auVar83._0_4_;
      auVar77._8_4_ = auVar92._8_4_ * auVar83._8_4_;
      auVar77._12_4_ = auVar92._12_4_ * auVar83._12_4_;
      auVar77._16_4_ = fVar136 * auVar83._16_4_;
      auVar77._20_4_ = fVar137 * auVar83._20_4_;
      auVar77._24_4_ = fVar160 * auVar83._24_4_;
      auVar77._28_4_ = auVar86._28_4_;
      auVar67 = vfmsub231ps_fma(auVar77,auVar91,auVar87);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar75,ZEXT1632(auVar66));
      auVar147._0_4_ = auVar87._0_4_ * auVar93._0_4_;
      auVar147._4_4_ = auVar87._4_4_ * auVar93._4_4_;
      auVar147._8_4_ = auVar87._8_4_ * auVar93._8_4_;
      auVar147._12_4_ = auVar87._12_4_ * auVar93._12_4_;
      auVar147._16_4_ = auVar87._16_4_ * fVar163;
      auVar147._20_4_ = auVar87._20_4_ * fVar162;
      auVar147._24_4_ = auVar87._24_4_ * fVar161;
      auVar147._28_4_ = 0;
      auVar66 = vfmsub231ps_fma(auVar147,auVar92,auVar85);
      auVar82 = vfmadd231ps_avx512vl(auVar86,auVar75,ZEXT1632(auVar66));
      auVar86 = vmulps_avx512vl(auVar73,auVar94);
      auVar86 = vfmsub231ps_avx512vl(auVar86,auVar84,auVar96);
      auVar81._4_4_ = auVar72._4_4_ * auVar96._4_4_;
      auVar81._0_4_ = auVar72._0_4_ * auVar96._0_4_;
      auVar81._8_4_ = auVar72._8_4_ * auVar96._8_4_;
      auVar81._12_4_ = auVar72._12_4_ * auVar96._12_4_;
      auVar81._16_4_ = auVar72._16_4_ * auVar96._16_4_;
      auVar81._20_4_ = auVar72._20_4_ * auVar96._20_4_;
      auVar81._24_4_ = auVar72._24_4_ * auVar96._24_4_;
      auVar81._28_4_ = auVar96._28_4_;
      auVar66 = vfmsub231ps_fma(auVar81,auVar95,auVar73);
      auVar148._0_4_ = auVar95._0_4_ * auVar84._0_4_;
      auVar148._4_4_ = auVar95._4_4_ * auVar84._4_4_;
      auVar148._8_4_ = auVar95._8_4_ * auVar84._8_4_;
      auVar148._12_4_ = auVar95._12_4_ * auVar84._12_4_;
      auVar148._16_4_ = auVar95._16_4_ * auVar84._16_4_;
      auVar148._20_4_ = auVar95._20_4_ * auVar84._20_4_;
      auVar148._24_4_ = auVar95._24_4_ * auVar84._24_4_;
      auVar148._28_4_ = 0;
      auVar67 = vfmsub231ps_fma(auVar148,auVar72,auVar94);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar75,auVar86);
      auVar74 = vfmadd231ps_avx512vl(auVar86,auVar75,ZEXT1632(auVar66));
      auVar86 = vmaxps_avx(auVar82,auVar74);
      uVar129 = vcmpps_avx512vl(auVar86,auVar75,2);
      bVar63 = bVar63 & (byte)uVar129;
      auVar182 = ZEXT3264(local_340);
      auVar184 = ZEXT3264(local_360);
      auVar186 = ZEXT3264(local_420);
      auVar185 = ZEXT3264(local_3a0);
      auVar183 = ZEXT3264(local_440);
      auVar188 = ZEXT3264(local_460);
      auVar179 = ZEXT3264(local_3c0);
      auVar187 = ZEXT3264(local_480);
      if (bVar63 == 0) {
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar180 = ZEXT3264(auVar86);
      }
      else {
        auVar28._4_4_ = auVar73._4_4_ * auVar87._4_4_;
        auVar28._0_4_ = auVar73._0_4_ * auVar87._0_4_;
        auVar28._8_4_ = auVar73._8_4_ * auVar87._8_4_;
        auVar28._12_4_ = auVar73._12_4_ * auVar87._12_4_;
        auVar28._16_4_ = auVar73._16_4_ * auVar87._16_4_;
        auVar28._20_4_ = auVar73._20_4_ * auVar87._20_4_;
        auVar28._24_4_ = auVar73._24_4_ * auVar87._24_4_;
        auVar28._28_4_ = auVar86._28_4_;
        auVar121 = vfmsub231ps_fma(auVar28,auVar72,auVar85);
        auVar29._4_4_ = auVar85._4_4_ * auVar84._4_4_;
        auVar29._0_4_ = auVar85._0_4_ * auVar84._0_4_;
        auVar29._8_4_ = auVar85._8_4_ * auVar84._8_4_;
        auVar29._12_4_ = auVar85._12_4_ * auVar84._12_4_;
        auVar29._16_4_ = auVar85._16_4_ * auVar84._16_4_;
        auVar29._20_4_ = auVar85._20_4_ * auVar84._20_4_;
        auVar29._24_4_ = auVar85._24_4_ * auVar84._24_4_;
        auVar29._28_4_ = auVar85._28_4_;
        auVar67 = vfmsub231ps_fma(auVar29,auVar83,auVar73);
        auVar30._4_4_ = auVar72._4_4_ * auVar83._4_4_;
        auVar30._0_4_ = auVar72._0_4_ * auVar83._0_4_;
        auVar30._8_4_ = auVar72._8_4_ * auVar83._8_4_;
        auVar30._12_4_ = auVar72._12_4_ * auVar83._12_4_;
        auVar30._16_4_ = auVar72._16_4_ * auVar83._16_4_;
        auVar30._20_4_ = auVar72._20_4_ * auVar83._20_4_;
        auVar30._24_4_ = auVar72._24_4_ * auVar83._24_4_;
        auVar30._28_4_ = auVar72._28_4_;
        auVar17 = vfmsub231ps_fma(auVar30,auVar84,auVar87);
        auVar66 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar67),ZEXT1632(auVar17));
        auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),ZEXT1632(auVar121),auVar75);
        auVar86 = vrcp14ps_avx512vl(auVar87);
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar180 = ZEXT3264(auVar85);
        auVar84 = vfnmadd213ps_avx512vl(auVar86,auVar87,auVar85);
        auVar66 = vfmadd132ps_fma(auVar84,auVar86,auVar86);
        auVar31._4_4_ = auVar17._4_4_ * auVar93._4_4_;
        auVar31._0_4_ = auVar17._0_4_ * auVar93._0_4_;
        auVar31._8_4_ = auVar17._8_4_ * auVar93._8_4_;
        auVar31._12_4_ = auVar17._12_4_ * auVar93._12_4_;
        auVar31._16_4_ = fVar163 * 0.0;
        auVar31._20_4_ = fVar162 * 0.0;
        auVar31._24_4_ = fVar161 * 0.0;
        auVar31._28_4_ = iVar1;
        auVar67 = vfmadd231ps_fma(auVar31,auVar92,ZEXT1632(auVar67));
        auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar91,ZEXT1632(auVar121));
        fVar128 = auVar66._0_4_;
        fVar135 = auVar66._4_4_;
        fVar136 = auVar66._8_4_;
        fVar137 = auVar66._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar67._12_4_ * fVar137,
                                       CONCAT48(auVar67._8_4_ * fVar136,
                                                CONCAT44(auVar67._4_4_ * fVar135,
                                                         auVar67._0_4_ * fVar128))));
        auVar168._8_4_ = 3;
        auVar168._0_8_ = 0x300000003;
        auVar168._12_4_ = 3;
        auVar168._16_4_ = 3;
        auVar168._20_4_ = 3;
        auVar168._24_4_ = 3;
        auVar168._28_4_ = 3;
        auVar86 = vpermps_avx2(auVar168,ZEXT1632((undefined1  [16])aVar5));
        uVar129 = vcmpps_avx512vl(auVar86,local_220,2);
        fVar156 = local_538->tfar;
        auVar23._4_4_ = fVar156;
        auVar23._0_4_ = fVar156;
        auVar23._8_4_ = fVar156;
        auVar23._12_4_ = fVar156;
        auVar23._16_4_ = fVar156;
        auVar23._20_4_ = fVar156;
        auVar23._24_4_ = fVar156;
        auVar23._28_4_ = fVar156;
        uVar21 = vcmpps_avx512vl(local_220,auVar23,2);
        bVar63 = (byte)uVar129 & (byte)uVar21 & bVar63;
        if (bVar63 != 0) {
          uVar129 = vcmpps_avx512vl(auVar87,auVar75,4);
          bVar63 = bVar63 & (byte)uVar129;
          if (bVar63 != 0) {
            fVar156 = auVar82._0_4_ * fVar128;
            fVar160 = auVar82._4_4_ * fVar135;
            auVar32._4_4_ = fVar160;
            auVar32._0_4_ = fVar156;
            fVar161 = auVar82._8_4_ * fVar136;
            auVar32._8_4_ = fVar161;
            fVar162 = auVar82._12_4_ * fVar137;
            auVar32._12_4_ = fVar162;
            fVar163 = auVar82._16_4_ * 0.0;
            auVar32._16_4_ = fVar163;
            fVar164 = auVar82._20_4_ * 0.0;
            auVar32._20_4_ = fVar164;
            fVar165 = auVar82._24_4_ * 0.0;
            auVar32._24_4_ = fVar165;
            auVar32._28_4_ = auVar87._28_4_;
            auVar86 = vsubps_avx512vl(auVar85,auVar32);
            local_260._0_4_ =
                 (float)((uint)(bVar55 & 1) * (int)fVar156 |
                        (uint)!(bool)(bVar55 & 1) * auVar86._0_4_);
            bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar60 * (int)fVar160 | (uint)!bVar60 * auVar86._4_4_);
            bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar60 * (int)fVar161 | (uint)!bVar60 * auVar86._8_4_);
            bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar60 * (int)fVar162 | (uint)!bVar60 * auVar86._12_4_)
            ;
            bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
            local_260._16_4_ = (float)((uint)bVar60 * (int)fVar163 | (uint)!bVar60 * auVar86._16_4_)
            ;
            bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
            local_260._20_4_ = (float)((uint)bVar60 * (int)fVar164 | (uint)!bVar60 * auVar86._20_4_)
            ;
            bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
            local_260._24_4_ = (float)((uint)bVar60 * (int)fVar165 | (uint)!bVar60 * auVar86._24_4_)
            ;
            bVar60 = SUB81(uVar58 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar60 * auVar87._28_4_ | (uint)!bVar60 * auVar86._28_4_);
            auVar86 = vsubps_avx512vl(ZEXT1632(auVar69),auVar79);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_260,auVar79);
            auVar126._0_4_ = auVar86._0_4_ + auVar86._0_4_;
            auVar126._4_4_ = auVar86._4_4_ + auVar86._4_4_;
            auVar126._8_4_ = auVar86._8_4_ + auVar86._8_4_;
            auVar126._12_4_ = auVar86._12_4_ + auVar86._12_4_;
            auVar126._16_4_ = auVar86._16_4_ + auVar86._16_4_;
            auVar126._20_4_ = auVar86._20_4_ + auVar86._20_4_;
            auVar126._24_4_ = auVar86._24_4_ + auVar86._24_4_;
            fVar160 = auVar86._28_4_;
            auVar126._28_4_ = fVar160 + fVar160;
            fVar156 = local_520->depth_scale;
            auVar79._4_4_ = fVar156;
            auVar79._0_4_ = fVar156;
            auVar79._8_4_ = fVar156;
            auVar79._12_4_ = fVar156;
            auVar79._16_4_ = fVar156;
            auVar79._20_4_ = fVar156;
            auVar79._24_4_ = fVar156;
            auVar79._28_4_ = fVar156;
            auVar86 = vmulps_avx512vl(auVar126,auVar79);
            uVar129 = vcmpps_avx512vl(local_220,auVar86,6);
            if (((byte)uVar129 & bVar63) != 0) {
              fVar128 = auVar74._0_4_ * fVar128;
              fVar135 = auVar74._4_4_ * fVar135;
              auVar33._4_4_ = fVar135;
              auVar33._0_4_ = fVar128;
              fVar136 = auVar74._8_4_ * fVar136;
              auVar33._8_4_ = fVar136;
              fVar137 = auVar74._12_4_ * fVar137;
              auVar33._12_4_ = fVar137;
              fVar156 = auVar74._16_4_ * 0.0;
              auVar33._16_4_ = fVar156;
              fVar161 = auVar74._20_4_ * 0.0;
              auVar33._20_4_ = fVar161;
              fVar162 = auVar74._24_4_ * 0.0;
              auVar33._24_4_ = fVar162;
              auVar33._28_4_ = fVar160;
              auVar86 = vsubps_avx512vl(auVar85,auVar33);
              auVar100._0_4_ =
                   (uint)(bVar55 & 1) * (int)fVar128 | (uint)!(bool)(bVar55 & 1) * auVar86._0_4_;
              bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
              auVar100._4_4_ = (uint)bVar60 * (int)fVar135 | (uint)!bVar60 * auVar86._4_4_;
              bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
              auVar100._8_4_ = (uint)bVar60 * (int)fVar136 | (uint)!bVar60 * auVar86._8_4_;
              bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
              auVar100._12_4_ = (uint)bVar60 * (int)fVar137 | (uint)!bVar60 * auVar86._12_4_;
              bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
              auVar100._16_4_ = (uint)bVar60 * (int)fVar156 | (uint)!bVar60 * auVar86._16_4_;
              bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
              auVar100._20_4_ = (uint)bVar60 * (int)fVar161 | (uint)!bVar60 * auVar86._20_4_;
              bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
              auVar100._24_4_ = (uint)bVar60 * (int)fVar162 | (uint)!bVar60 * auVar86._24_4_;
              bVar60 = SUB81(uVar58 >> 7,0);
              auVar100._28_4_ = (uint)bVar60 * (int)fVar160 | (uint)!bVar60 * auVar86._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar100,auVar85,auVar24);
              local_200 = 0;
              local_1fc = iVar8;
              local_1f0 = local_3d0;
              local_1e0 = local_3e0;
              local_1d0 = *(undefined8 *)*pauVar3;
              uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
              if ((pGVar9->mask & local_538->mask) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar60 = true, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01800944;
                fVar156 = 1.0 / auVar80._0_4_;
                local_1a0[0] = fVar156 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar156 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar156 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar156 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar156 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar156 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar156 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                lVar57 = 0;
                uVar59 = (ulong)((byte)uVar129 & bVar63);
                for (uVar58 = uVar59; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000)
                {
                  lVar57 = lVar57 + 1;
                }
                local_3f0 = auVar68;
                while (auVar66 = auVar181._0_16_, auVar68 = local_3f0, uVar59 != 0) {
                  local_2a0._0_8_ = uVar59;
                  local_4c4 = local_1a0[lVar57];
                  local_4c0 = *(undefined4 *)(local_180 + lVar57 * 4);
                  local_528 = CONCAT44(local_528._4_4_,local_538->tfar);
                  local_2c0._0_8_ = lVar57;
                  local_538->tfar = *(float *)(local_160 + lVar57 * 4);
                  local_500.context = context->user;
                  fVar156 = 1.0 - local_4c4;
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar156 + fVar156))),
                                             ZEXT416((uint)fVar156),ZEXT416((uint)fVar156));
                  auVar121 = ZEXT416((uint)local_4c4);
                  auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar121,
                                            ZEXT416(0xc0a00000));
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                            ZEXT416((uint)(local_4c4 + local_4c4)),auVar68);
                  auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar121,
                                            ZEXT416(0x40000000));
                  auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * -3.0)),
                                            ZEXT416((uint)(fVar156 + fVar156)),auVar68);
                  auVar121 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar121,
                                             ZEXT416((uint)(fVar156 * -2.0)));
                  fVar156 = auVar17._0_4_ * 0.5;
                  fVar128 = auVar67._0_4_ * 0.5;
                  fVar135 = auVar68._0_4_ * 0.5;
                  fVar136 = auVar121._0_4_ * 0.5;
                  auVar140._0_4_ = fVar136 * local_380;
                  auVar140._4_4_ = fVar136 * fStack_37c;
                  auVar140._8_4_ = fVar136 * fStack_378;
                  auVar140._12_4_ = fVar136 * fStack_374;
                  auVar154._4_4_ = fVar135;
                  auVar154._0_4_ = fVar135;
                  auVar154._8_4_ = fVar135;
                  auVar154._12_4_ = fVar135;
                  auVar52._8_8_ = uStack_508;
                  auVar52._0_8_ = local_510;
                  auVar68 = vfmadd132ps_fma(auVar154,auVar140,auVar52);
                  auVar141._4_4_ = fVar128;
                  auVar141._0_4_ = fVar128;
                  auVar141._8_4_ = fVar128;
                  auVar141._12_4_ = fVar128;
                  auVar68 = vfmadd213ps_fma(auVar141,local_3e0,auVar68);
                  auVar133._4_4_ = fVar156;
                  auVar133._0_4_ = fVar156;
                  auVar133._8_4_ = fVar156;
                  auVar133._12_4_ = fVar156;
                  auVar68 = vfmadd213ps_fma(auVar133,local_3d0,auVar68);
                  local_4d0 = vmovlps_avx(auVar68);
                  local_4c8 = vextractps_avx(auVar68,2);
                  local_4bc = (int)local_488;
                  local_4b8 = (int)local_530;
                  local_4b4 = (local_500.context)->instID[0];
                  local_4b0 = (local_500.context)->instPrimID[0];
                  local_54c = -1;
                  local_500.valid = &local_54c;
                  local_500.geometryUserPtr = pGVar9->userPtr;
                  local_500.ray = (RTCRayN *)local_538;
                  local_500.hit = (RTCHitN *)&local_4d0;
                  local_500.N = 1;
                  if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar9->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var10)(&local_500), *local_500.valid != 0)))) {
                      bVar60 = true;
                      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar180 = ZEXT3264(auVar86);
                      auVar68 = vxorps_avx512vl(auVar66,auVar66);
                      auVar181 = ZEXT1664(auVar68);
                      auVar182 = ZEXT3264(local_340);
                      auVar184 = ZEXT3264(local_360);
                      auVar186 = ZEXT3264(local_420);
                      auVar185 = ZEXT3264(local_3a0);
                      auVar183 = ZEXT3264(local_440);
                      auVar188 = ZEXT3264(local_460);
                      auVar179 = ZEXT3264(local_3c0);
                      auVar187 = ZEXT3264(local_480);
                      auVar68 = local_3f0;
                      goto LAB_01800944;
                    }
                  }
                  local_538->tfar = (float)local_528;
                  lVar57 = 0;
                  uVar59 = local_2a0._0_8_ ^ 1L << (local_2c0._0_8_ & 0x3f);
                  for (uVar58 = uVar59; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000
                      ) {
                    lVar57 = lVar57 + 1;
                  }
                  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar180 = ZEXT3264(auVar86);
                  auVar68 = vxorps_avx512vl(auVar66,auVar66);
                  auVar181 = ZEXT1664(auVar68);
                  auVar182 = ZEXT3264(local_340);
                  auVar184 = ZEXT3264(local_360);
                  auVar186 = ZEXT3264(local_420);
                  auVar185 = ZEXT3264(local_3a0);
                  auVar183 = ZEXT3264(local_440);
                  auVar188 = ZEXT3264(local_460);
                  auVar179 = ZEXT3264(local_3c0);
                  auVar187 = ZEXT3264(local_480);
                }
              }
            }
          }
          bVar60 = false;
          goto LAB_01800944;
        }
      }
      bVar60 = false;
    }
LAB_01800944:
    if (8 < iVar8) {
      local_2a0 = vpbroadcastd_avx512vl();
      local_2c0 = vbroadcastss_avx512vl(auVar68);
      auVar122._8_4_ = 3;
      auVar122._0_8_ = 0x300000003;
      auVar122._12_4_ = 3;
      auVar122._16_4_ = 3;
      auVar122._20_4_ = 3;
      auVar122._24_4_ = 3;
      auVar122._28_4_ = 3;
      local_2e0 = vpermps_avx2(auVar122,local_2e0);
      local_300._4_4_ = 1.0 / (float)local_300._0_4_;
      local_300._0_4_ = local_300._4_4_;
      fStack_2f8 = (float)local_300._4_4_;
      fStack_2f4 = (float)local_300._4_4_;
      fStack_2f0 = (float)local_300._4_4_;
      fStack_2ec = (float)local_300._4_4_;
      fStack_2e8 = (float)local_300._4_4_;
      fStack_2e4 = (float)local_300._4_4_;
      local_3a0 = auVar185._0_32_;
      local_3c0 = auVar179._0_32_;
      uVar58 = local_530;
      for (lVar57 = 8; lVar57 < local_548; lVar57 = lVar57 + 8) {
        auVar86 = vpbroadcastd_avx512vl();
        auVar72 = vpor_avx2(auVar86,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar72,local_2a0,1);
        auVar86 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar57 * 4 + lVar62);
        auVar87 = *(undefined1 (*) [32])(lVar62 + 0x22047f0 + lVar57 * 4);
        auVar85 = *(undefined1 (*) [32])(lVar62 + 0x2204c74 + lVar57 * 4);
        auVar84 = *(undefined1 (*) [32])(lVar62 + 0x22050f8 + lVar57 * 4);
        auVar88 = auVar179._0_32_;
        auVar73 = vmulps_avx512vl(auVar88,auVar84);
        auVar92 = auVar187._0_32_;
        auVar83 = vmulps_avx512vl(auVar92,auVar84);
        auVar34._4_4_ = auVar84._4_4_ * (float)local_e0._4_4_;
        auVar34._0_4_ = auVar84._0_4_ * (float)local_e0._0_4_;
        auVar34._8_4_ = auVar84._8_4_ * fStack_d8;
        auVar34._12_4_ = auVar84._12_4_ * fStack_d4;
        auVar34._16_4_ = auVar84._16_4_ * fStack_d0;
        auVar34._20_4_ = auVar84._20_4_ * fStack_cc;
        auVar34._24_4_ = auVar84._24_4_ * fStack_c8;
        auVar34._28_4_ = auVar72._28_4_;
        auVar89 = auVar183._0_32_;
        auVar72 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar89);
        auVar93 = auVar188._0_32_;
        auVar73 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar93);
        auVar83 = vfmadd231ps_avx512vl(auVar34,auVar85,local_c0);
        auVar91 = auVar186._0_32_;
        auVar72 = vfmadd231ps_avx512vl(auVar72,auVar87,auVar91);
        auVar90 = auVar185._0_32_;
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar87,auVar90);
        auVar68 = vfmadd231ps_fma(auVar83,auVar87,local_a0);
        local_340 = auVar182._0_32_;
        auVar75 = vfmadd231ps_avx512vl(auVar72,auVar86,local_340);
        local_360 = auVar184._0_32_;
        auVar76 = vfmadd231ps_avx512vl(auVar73,auVar86,local_360);
        auVar72 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar57 * 4 + lVar62);
        auVar73 = *(undefined1 (*) [32])(lVar62 + 0x2206c10 + lVar57 * 4);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar86,local_80);
        auVar83 = *(undefined1 (*) [32])(lVar62 + 0x2207094 + lVar57 * 4);
        auVar82 = *(undefined1 (*) [32])(lVar62 + 0x2207518 + lVar57 * 4);
        auVar74 = vmulps_avx512vl(auVar88,auVar82);
        auVar77 = vmulps_avx512vl(auVar92,auVar82);
        auVar35._4_4_ = auVar82._4_4_ * (float)local_e0._4_4_;
        auVar35._0_4_ = auVar82._0_4_ * (float)local_e0._0_4_;
        auVar35._8_4_ = auVar82._8_4_ * fStack_d8;
        auVar35._12_4_ = auVar82._12_4_ * fStack_d4;
        auVar35._16_4_ = auVar82._16_4_ * fStack_d0;
        auVar35._20_4_ = auVar82._20_4_ * fStack_cc;
        auVar35._24_4_ = auVar82._24_4_ * fStack_c8;
        auVar35._28_4_ = uStack_c4;
        auVar74 = vfmadd231ps_avx512vl(auVar74,auVar83,auVar89);
        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar83,auVar93);
        auVar78 = vfmadd231ps_avx512vl(auVar35,auVar83,local_c0);
        auVar74 = vfmadd231ps_avx512vl(auVar74,auVar73,auVar91);
        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar73,auVar90);
        auVar66 = vfmadd231ps_fma(auVar78,auVar73,local_a0);
        auVar78 = vfmadd231ps_avx512vl(auVar74,auVar72,local_340);
        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar72,local_360);
        auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar72,local_80);
        auVar79 = vmaxps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar66));
        auVar74 = vsubps_avx(auVar78,auVar75);
        auVar80 = vsubps_avx512vl(auVar77,auVar76);
        auVar81 = vmulps_avx512vl(auVar76,auVar74);
        auVar101 = vmulps_avx512vl(auVar75,auVar80);
        auVar81 = vsubps_avx512vl(auVar81,auVar101);
        auVar101 = vmulps_avx512vl(auVar80,auVar80);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar74,auVar74);
        auVar79 = vmulps_avx512vl(auVar79,auVar79);
        auVar79 = vmulps_avx512vl(auVar79,auVar101);
        auVar81 = vmulps_avx512vl(auVar81,auVar81);
        uVar129 = vcmpps_avx512vl(auVar81,auVar79,2);
        bVar63 = (byte)uVar21 & (byte)uVar129;
        if (bVar63 == 0) {
          auVar183 = ZEXT3264(auVar89);
          auVar179 = ZEXT3264(auVar88);
          auVar187 = ZEXT3264(auVar92);
        }
        else {
          auVar82 = vmulps_avx512vl(local_140,auVar82);
          auVar83 = vfmadd213ps_avx512vl(auVar83,local_120,auVar82);
          auVar73 = vfmadd213ps_avx512vl(auVar73,local_100,auVar83);
          auVar72 = vfmadd213ps_avx512vl(auVar72,local_320,auVar73);
          auVar84 = vmulps_avx512vl(local_140,auVar84);
          auVar85 = vfmadd213ps_avx512vl(auVar85,local_120,auVar84);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_100,auVar85);
          auVar73 = vfmadd213ps_avx512vl(auVar86,local_320,auVar87);
          auVar86 = *(undefined1 (*) [32])(lVar62 + 0x220557c + lVar57 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar62 + 0x2205a00 + lVar57 * 4);
          auVar85 = *(undefined1 (*) [32])(lVar62 + 0x2205e84 + lVar57 * 4);
          auVar84 = *(undefined1 (*) [32])(lVar62 + 0x2206308 + lVar57 * 4);
          auVar83 = vmulps_avx512vl(auVar88,auVar84);
          auVar82 = vmulps_avx512vl(auVar92,auVar84);
          auVar84 = vmulps_avx512vl(local_140,auVar84);
          auVar67 = vfmadd231ps_fma(auVar83,auVar85,auVar89);
          auVar83 = vfmadd231ps_avx512vl(auVar82,auVar85,auVar93);
          auVar85 = vfmadd231ps_avx512vl(auVar84,local_120,auVar85);
          auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar87,auVar91);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar90);
          auVar87 = vfmadd231ps_avx512vl(auVar85,local_100,auVar87);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,local_340);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar86,local_360);
          auVar82 = vfmadd231ps_avx512vl(auVar87,local_320,auVar86);
          auVar86 = *(undefined1 (*) [32])(lVar62 + 0x220799c + lVar57 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar62 + 0x22082a4 + lVar57 * 4);
          auVar85 = *(undefined1 (*) [32])(lVar62 + 0x2208728 + lVar57 * 4);
          auVar79 = vmulps_avx512vl(auVar88,auVar85);
          auVar81 = vmulps_avx512vl(auVar92,auVar85);
          auVar85 = vmulps_avx512vl(local_140,auVar85);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar87,auVar89);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar93);
          auVar85 = vfmadd231ps_avx512vl(auVar85,local_120,auVar87);
          auVar87 = *(undefined1 (*) [32])(lVar62 + 0x2207e20 + lVar57 * 4);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar87,auVar91);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar90);
          auVar87 = vfmadd231ps_avx512vl(auVar85,local_100,auVar87);
          auVar85 = vfmadd231ps_avx512vl(auVar79,auVar86,local_340);
          auVar79 = vfmadd231ps_avx512vl(auVar81,auVar86,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,local_320,auVar86);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar84,auVar81);
          vandps_avx512vl(auVar83,auVar81);
          auVar86 = vmaxps_avx(auVar81,auVar81);
          vandps_avx512vl(auVar82,auVar81);
          auVar86 = vmaxps_avx(auVar86,auVar81);
          uVar59 = vcmpps_avx512vl(auVar86,local_2c0,1);
          bVar11 = (bool)((byte)uVar59 & 1);
          auVar102._0_4_ = (float)((uint)bVar11 * auVar74._0_4_ | (uint)!bVar11 * auVar84._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar102._4_4_ = (float)((uint)bVar11 * auVar74._4_4_ | (uint)!bVar11 * auVar84._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar102._8_4_ = (float)((uint)bVar11 * auVar74._8_4_ | (uint)!bVar11 * auVar84._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar102._12_4_ = (float)((uint)bVar11 * auVar74._12_4_ | (uint)!bVar11 * auVar84._12_4_);
          bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar102._16_4_ = (float)((uint)bVar11 * auVar74._16_4_ | (uint)!bVar11 * auVar84._16_4_);
          bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar102._20_4_ = (float)((uint)bVar11 * auVar74._20_4_ | (uint)!bVar11 * auVar84._20_4_);
          bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar102._24_4_ = (float)((uint)bVar11 * auVar74._24_4_ | (uint)!bVar11 * auVar84._24_4_);
          bVar11 = SUB81(uVar59 >> 7,0);
          auVar102._28_4_ = (uint)bVar11 * auVar74._28_4_ | (uint)!bVar11 * auVar84._28_4_;
          bVar11 = (bool)((byte)uVar59 & 1);
          auVar103._0_4_ = (float)((uint)bVar11 * auVar80._0_4_ | (uint)!bVar11 * auVar83._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar103._4_4_ = (float)((uint)bVar11 * auVar80._4_4_ | (uint)!bVar11 * auVar83._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar103._8_4_ = (float)((uint)bVar11 * auVar80._8_4_ | (uint)!bVar11 * auVar83._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar103._12_4_ = (float)((uint)bVar11 * auVar80._12_4_ | (uint)!bVar11 * auVar83._12_4_);
          bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar103._16_4_ = (float)((uint)bVar11 * auVar80._16_4_ | (uint)!bVar11 * auVar83._16_4_);
          bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar103._20_4_ = (float)((uint)bVar11 * auVar80._20_4_ | (uint)!bVar11 * auVar83._20_4_);
          bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar103._24_4_ = (float)((uint)bVar11 * auVar80._24_4_ | (uint)!bVar11 * auVar83._24_4_);
          bVar11 = SUB81(uVar59 >> 7,0);
          auVar103._28_4_ = (uint)bVar11 * auVar80._28_4_ | (uint)!bVar11 * auVar83._28_4_;
          vandps_avx512vl(auVar85,auVar81);
          vandps_avx512vl(auVar79,auVar81);
          auVar86 = vmaxps_avx(auVar103,auVar103);
          vandps_avx512vl(auVar87,auVar81);
          auVar86 = vmaxps_avx(auVar86,auVar103);
          uVar59 = vcmpps_avx512vl(auVar86,local_2c0,1);
          bVar11 = (bool)((byte)uVar59 & 1);
          auVar104._0_4_ = (uint)bVar11 * auVar74._0_4_ | (uint)!bVar11 * auVar85._0_4_;
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar104._4_4_ = (uint)bVar11 * auVar74._4_4_ | (uint)!bVar11 * auVar85._4_4_;
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar104._8_4_ = (uint)bVar11 * auVar74._8_4_ | (uint)!bVar11 * auVar85._8_4_;
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar104._12_4_ = (uint)bVar11 * auVar74._12_4_ | (uint)!bVar11 * auVar85._12_4_;
          bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar104._16_4_ = (uint)bVar11 * auVar74._16_4_ | (uint)!bVar11 * auVar85._16_4_;
          bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar104._20_4_ = (uint)bVar11 * auVar74._20_4_ | (uint)!bVar11 * auVar85._20_4_;
          bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar104._24_4_ = (uint)bVar11 * auVar74._24_4_ | (uint)!bVar11 * auVar85._24_4_;
          bVar11 = SUB81(uVar59 >> 7,0);
          auVar104._28_4_ = (uint)bVar11 * auVar74._28_4_ | (uint)!bVar11 * auVar85._28_4_;
          bVar11 = (bool)((byte)uVar59 & 1);
          auVar105._0_4_ = (float)((uint)bVar11 * auVar80._0_4_ | (uint)!bVar11 * auVar79._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar105._4_4_ = (float)((uint)bVar11 * auVar80._4_4_ | (uint)!bVar11 * auVar79._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar105._8_4_ = (float)((uint)bVar11 * auVar80._8_4_ | (uint)!bVar11 * auVar79._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar105._12_4_ = (float)((uint)bVar11 * auVar80._12_4_ | (uint)!bVar11 * auVar79._12_4_);
          bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar105._16_4_ = (float)((uint)bVar11 * auVar80._16_4_ | (uint)!bVar11 * auVar79._16_4_);
          bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar105._20_4_ = (float)((uint)bVar11 * auVar80._20_4_ | (uint)!bVar11 * auVar79._20_4_);
          bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar105._24_4_ = (float)((uint)bVar11 * auVar80._24_4_ | (uint)!bVar11 * auVar79._24_4_);
          bVar11 = SUB81(uVar59 >> 7,0);
          auVar105._28_4_ = (uint)bVar11 * auVar80._28_4_ | (uint)!bVar11 * auVar79._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar86 = vxorps_avx512vl(auVar104,auVar172);
          auVar80 = auVar181._0_32_;
          auVar87 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar80);
          auVar67 = vfmadd231ps_fma(auVar87,auVar103,auVar103);
          auVar87 = vrsqrt14ps_avx512vl(ZEXT1632(auVar67));
          auVar178._8_4_ = 0xbf000000;
          auVar178._0_8_ = 0xbf000000bf000000;
          auVar178._12_4_ = 0xbf000000;
          auVar178._16_4_ = 0xbf000000;
          auVar178._20_4_ = 0xbf000000;
          auVar178._24_4_ = 0xbf000000;
          auVar178._28_4_ = 0xbf000000;
          fVar156 = auVar87._0_4_;
          fVar128 = auVar87._4_4_;
          fVar135 = auVar87._8_4_;
          fVar136 = auVar87._12_4_;
          fVar137 = auVar87._16_4_;
          fVar160 = auVar87._20_4_;
          fVar161 = auVar87._24_4_;
          auVar36._4_4_ = fVar128 * fVar128 * fVar128 * auVar67._4_4_ * -0.5;
          auVar36._0_4_ = fVar156 * fVar156 * fVar156 * auVar67._0_4_ * -0.5;
          auVar36._8_4_ = fVar135 * fVar135 * fVar135 * auVar67._8_4_ * -0.5;
          auVar36._12_4_ = fVar136 * fVar136 * fVar136 * auVar67._12_4_ * -0.5;
          auVar36._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
          auVar36._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar36._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar36._28_4_ = auVar103._28_4_;
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar87 = vfmadd231ps_avx512vl(auVar36,auVar85,auVar87);
          auVar37._4_4_ = auVar103._4_4_ * auVar87._4_4_;
          auVar37._0_4_ = auVar103._0_4_ * auVar87._0_4_;
          auVar37._8_4_ = auVar103._8_4_ * auVar87._8_4_;
          auVar37._12_4_ = auVar103._12_4_ * auVar87._12_4_;
          auVar37._16_4_ = auVar103._16_4_ * auVar87._16_4_;
          auVar37._20_4_ = auVar103._20_4_ * auVar87._20_4_;
          auVar37._24_4_ = auVar103._24_4_ * auVar87._24_4_;
          auVar37._28_4_ = 0;
          auVar38._4_4_ = auVar87._4_4_ * -auVar102._4_4_;
          auVar38._0_4_ = auVar87._0_4_ * -auVar102._0_4_;
          auVar38._8_4_ = auVar87._8_4_ * -auVar102._8_4_;
          auVar38._12_4_ = auVar87._12_4_ * -auVar102._12_4_;
          auVar38._16_4_ = auVar87._16_4_ * -auVar102._16_4_;
          auVar38._20_4_ = auVar87._20_4_ * -auVar102._20_4_;
          auVar38._24_4_ = auVar87._24_4_ * -auVar102._24_4_;
          auVar38._28_4_ = auVar103._28_4_;
          auVar84 = vmulps_avx512vl(auVar87,auVar80);
          auVar87 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar80);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar105,auVar105);
          auVar83 = vrsqrt14ps_avx512vl(auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar178);
          fVar156 = auVar83._0_4_;
          fVar128 = auVar83._4_4_;
          fVar135 = auVar83._8_4_;
          fVar136 = auVar83._12_4_;
          fVar137 = auVar83._16_4_;
          fVar160 = auVar83._20_4_;
          fVar161 = auVar83._24_4_;
          auVar39._4_4_ = fVar128 * fVar128 * fVar128 * auVar87._4_4_;
          auVar39._0_4_ = fVar156 * fVar156 * fVar156 * auVar87._0_4_;
          auVar39._8_4_ = fVar135 * fVar135 * fVar135 * auVar87._8_4_;
          auVar39._12_4_ = fVar136 * fVar136 * fVar136 * auVar87._12_4_;
          auVar39._16_4_ = fVar137 * fVar137 * fVar137 * auVar87._16_4_;
          auVar39._20_4_ = fVar160 * fVar160 * fVar160 * auVar87._20_4_;
          auVar39._24_4_ = fVar161 * fVar161 * fVar161 * auVar87._24_4_;
          auVar39._28_4_ = auVar87._28_4_;
          auVar87 = vfmadd231ps_avx512vl(auVar39,auVar85,auVar83);
          auVar40._4_4_ = auVar105._4_4_ * auVar87._4_4_;
          auVar40._0_4_ = auVar105._0_4_ * auVar87._0_4_;
          auVar40._8_4_ = auVar105._8_4_ * auVar87._8_4_;
          auVar40._12_4_ = auVar105._12_4_ * auVar87._12_4_;
          auVar40._16_4_ = auVar105._16_4_ * auVar87._16_4_;
          auVar40._20_4_ = auVar105._20_4_ * auVar87._20_4_;
          auVar40._24_4_ = auVar105._24_4_ * auVar87._24_4_;
          auVar40._28_4_ = auVar83._28_4_;
          auVar41._4_4_ = auVar87._4_4_ * auVar86._4_4_;
          auVar41._0_4_ = auVar87._0_4_ * auVar86._0_4_;
          auVar41._8_4_ = auVar87._8_4_ * auVar86._8_4_;
          auVar41._12_4_ = auVar87._12_4_ * auVar86._12_4_;
          auVar41._16_4_ = auVar87._16_4_ * auVar86._16_4_;
          auVar41._20_4_ = auVar87._20_4_ * auVar86._20_4_;
          auVar41._24_4_ = auVar87._24_4_ * auVar86._24_4_;
          auVar41._28_4_ = auVar86._28_4_;
          auVar86 = vmulps_avx512vl(auVar87,auVar80);
          auVar67 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar68),auVar75);
          auVar87 = ZEXT1632(auVar68);
          auVar121 = vfmadd213ps_fma(auVar38,auVar87,auVar76);
          auVar85 = vfmadd213ps_avx512vl(auVar84,auVar87,auVar73);
          auVar83 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar66),auVar78);
          auVar69 = vfnmadd213ps_fma(auVar37,auVar87,auVar75);
          auVar82 = ZEXT1632(auVar66);
          auVar17 = vfmadd213ps_fma(auVar41,auVar82,auVar77);
          auVar70 = vfnmadd213ps_fma(auVar38,auVar87,auVar76);
          auVar18 = vfmadd213ps_fma(auVar86,auVar82,auVar72);
          auVar79 = ZEXT1632(auVar68);
          auVar64 = vfnmadd231ps_fma(auVar73,auVar79,auVar84);
          auVar71 = vfnmadd213ps_fma(auVar40,auVar82,auVar78);
          auVar65 = vfnmadd213ps_fma(auVar41,auVar82,auVar77);
          auVar119 = vfnmadd231ps_fma(auVar72,ZEXT1632(auVar66),auVar86);
          auVar72 = vsubps_avx512vl(auVar83,ZEXT1632(auVar69));
          auVar86 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar70));
          auVar87 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar64));
          auVar42._4_4_ = auVar86._4_4_ * auVar64._4_4_;
          auVar42._0_4_ = auVar86._0_4_ * auVar64._0_4_;
          auVar42._8_4_ = auVar86._8_4_ * auVar64._8_4_;
          auVar42._12_4_ = auVar86._12_4_ * auVar64._12_4_;
          auVar42._16_4_ = auVar86._16_4_ * 0.0;
          auVar42._20_4_ = auVar86._20_4_ * 0.0;
          auVar42._24_4_ = auVar86._24_4_ * 0.0;
          auVar42._28_4_ = auVar84._28_4_;
          auVar68 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar70),auVar87);
          auVar43._4_4_ = auVar87._4_4_ * auVar69._4_4_;
          auVar43._0_4_ = auVar87._0_4_ * auVar69._0_4_;
          auVar43._8_4_ = auVar87._8_4_ * auVar69._8_4_;
          auVar43._12_4_ = auVar87._12_4_ * auVar69._12_4_;
          auVar43._16_4_ = auVar87._16_4_ * 0.0;
          auVar43._20_4_ = auVar87._20_4_ * 0.0;
          auVar43._24_4_ = auVar87._24_4_ * 0.0;
          auVar43._28_4_ = auVar87._28_4_;
          auVar19 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar64),auVar72);
          auVar44._4_4_ = auVar70._4_4_ * auVar72._4_4_;
          auVar44._0_4_ = auVar70._0_4_ * auVar72._0_4_;
          auVar44._8_4_ = auVar70._8_4_ * auVar72._8_4_;
          auVar44._12_4_ = auVar70._12_4_ * auVar72._12_4_;
          auVar44._16_4_ = auVar72._16_4_ * 0.0;
          auVar44._20_4_ = auVar72._20_4_ * 0.0;
          auVar44._24_4_ = auVar72._24_4_ * 0.0;
          auVar44._28_4_ = auVar72._28_4_;
          auVar20 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar69),auVar86);
          auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar80,ZEXT1632(auVar19));
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,ZEXT1632(auVar68));
          uVar59 = vcmpps_avx512vl(auVar86,auVar80,2);
          bVar55 = (byte)uVar59;
          fVar164 = (float)((uint)(bVar55 & 1) * auVar67._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar71._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          fVar112 = (float)((uint)bVar11 * auVar67._4_4_ | (uint)!bVar11 * auVar71._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          fVar114 = (float)((uint)bVar11 * auVar67._8_4_ | (uint)!bVar11 * auVar71._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          fVar116 = (float)((uint)bVar11 * auVar67._12_4_ | (uint)!bVar11 * auVar71._12_4_);
          auVar82 = ZEXT1632(CONCAT412(fVar116,CONCAT48(fVar114,CONCAT44(fVar112,fVar164))));
          fVar165 = (float)((uint)(bVar55 & 1) * auVar121._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar65._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          fVar113 = (float)((uint)bVar11 * auVar121._4_4_ | (uint)!bVar11 * auVar65._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          fVar115 = (float)((uint)bVar11 * auVar121._8_4_ | (uint)!bVar11 * auVar65._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          fVar117 = (float)((uint)bVar11 * auVar121._12_4_ | (uint)!bVar11 * auVar65._12_4_);
          auVar74 = ZEXT1632(CONCAT412(fVar117,CONCAT48(fVar115,CONCAT44(fVar113,fVar165))));
          auVar106._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar119._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar106._4_4_ = (float)((uint)bVar11 * auVar85._4_4_ | (uint)!bVar11 * auVar119._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar106._8_4_ = (float)((uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * auVar119._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar106._12_4_ = (float)((uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * auVar119._12_4_)
          ;
          fVar156 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar85._16_4_);
          auVar106._16_4_ = fVar156;
          fVar128 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar85._20_4_);
          auVar106._20_4_ = fVar128;
          fVar135 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar85._24_4_);
          auVar106._24_4_ = fVar135;
          iVar1 = (uint)(byte)(uVar59 >> 7) * auVar85._28_4_;
          auVar106._28_4_ = iVar1;
          auVar86 = vblendmps_avx512vl(ZEXT1632(auVar69),auVar83);
          auVar107._0_4_ =
               (uint)(bVar55 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar68._0_4_;
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar107._4_4_ = (uint)bVar11 * auVar86._4_4_ | (uint)!bVar11 * auVar68._4_4_;
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar107._8_4_ = (uint)bVar11 * auVar86._8_4_ | (uint)!bVar11 * auVar68._8_4_;
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar107._12_4_ = (uint)bVar11 * auVar86._12_4_ | (uint)!bVar11 * auVar68._12_4_;
          auVar107._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar86._16_4_;
          auVar107._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar86._20_4_;
          auVar107._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar86._24_4_;
          auVar107._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar86._28_4_;
          auVar86 = vblendmps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar17));
          auVar108._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar67._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar108._4_4_ = (float)((uint)bVar11 * auVar86._4_4_ | (uint)!bVar11 * auVar67._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar108._8_4_ = (float)((uint)bVar11 * auVar86._8_4_ | (uint)!bVar11 * auVar67._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar108._12_4_ = (float)((uint)bVar11 * auVar86._12_4_ | (uint)!bVar11 * auVar67._12_4_);
          fVar136 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar86._16_4_);
          auVar108._16_4_ = fVar136;
          fVar160 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar86._20_4_);
          auVar108._20_4_ = fVar160;
          fVar137 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar86._24_4_);
          auVar108._24_4_ = fVar137;
          auVar108._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar86._28_4_;
          auVar86 = vblendmps_avx512vl(ZEXT1632(auVar64),ZEXT1632(auVar18));
          auVar109._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar121._0_4_);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar109._4_4_ = (float)((uint)bVar11 * auVar86._4_4_ | (uint)!bVar11 * auVar121._4_4_);
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar109._8_4_ = (float)((uint)bVar11 * auVar86._8_4_ | (uint)!bVar11 * auVar121._8_4_);
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar109._12_4_ = (float)((uint)bVar11 * auVar86._12_4_ | (uint)!bVar11 * auVar121._12_4_)
          ;
          fVar161 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar86._16_4_);
          auVar109._16_4_ = fVar161;
          fVar162 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar86._20_4_);
          auVar109._20_4_ = fVar162;
          fVar163 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar86._24_4_);
          auVar109._24_4_ = fVar163;
          iVar2 = (uint)(byte)(uVar59 >> 7) * auVar86._28_4_;
          auVar109._28_4_ = iVar2;
          auVar110._0_4_ =
               (uint)(bVar55 & 1) * (int)auVar69._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar83._0_4_;
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar110._4_4_ = (uint)bVar11 * (int)auVar69._4_4_ | (uint)!bVar11 * auVar83._4_4_;
          bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar110._8_4_ = (uint)bVar11 * (int)auVar69._8_4_ | (uint)!bVar11 * auVar83._8_4_;
          bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar110._12_4_ = (uint)bVar11 * (int)auVar69._12_4_ | (uint)!bVar11 * auVar83._12_4_;
          auVar110._16_4_ = (uint)!(bool)((byte)(uVar59 >> 4) & 1) * auVar83._16_4_;
          auVar110._20_4_ = (uint)!(bool)((byte)(uVar59 >> 5) & 1) * auVar83._20_4_;
          auVar110._24_4_ = (uint)!(bool)((byte)(uVar59 >> 6) & 1) * auVar83._24_4_;
          auVar110._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar83._28_4_;
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar83 = vsubps_avx512vl(auVar110,auVar82);
          auVar87 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar70._12_4_ |
                                                  (uint)!bVar15 * auVar17._12_4_,
                                                  CONCAT48((uint)bVar13 * (int)auVar70._8_4_ |
                                                           (uint)!bVar13 * auVar17._8_4_,
                                                           CONCAT44((uint)bVar11 *
                                                                    (int)auVar70._4_4_ |
                                                                    (uint)!bVar11 * auVar17._4_4_,
                                                                    (uint)(bVar55 & 1) *
                                                                    (int)auVar70._0_4_ |
                                                                    (uint)!(bool)(bVar55 & 1) *
                                                                    auVar17._0_4_)))),auVar74);
          auVar85 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar64._12_4_ |
                                                  (uint)!bVar16 * auVar18._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar64._8_4_ |
                                                           (uint)!bVar14 * auVar18._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar64._4_4_ |
                                                                    (uint)!bVar12 * auVar18._4_4_,
                                                                    (uint)(bVar55 & 1) *
                                                                    (int)auVar64._0_4_ |
                                                                    (uint)!(bool)(bVar55 & 1) *
                                                                    auVar18._0_4_)))),auVar106);
          auVar84 = vsubps_avx(auVar82,auVar107);
          auVar72 = vsubps_avx(auVar74,auVar108);
          auVar73 = vsubps_avx(auVar106,auVar109);
          auVar45._4_4_ = auVar85._4_4_ * fVar112;
          auVar45._0_4_ = auVar85._0_4_ * fVar164;
          auVar45._8_4_ = auVar85._8_4_ * fVar114;
          auVar45._12_4_ = auVar85._12_4_ * fVar116;
          auVar45._16_4_ = auVar85._16_4_ * 0.0;
          auVar45._20_4_ = auVar85._20_4_ * 0.0;
          auVar45._24_4_ = auVar85._24_4_ * 0.0;
          auVar45._28_4_ = 0;
          auVar68 = vfmsub231ps_fma(auVar45,auVar106,auVar83);
          auVar144._0_4_ = fVar165 * auVar83._0_4_;
          auVar144._4_4_ = fVar113 * auVar83._4_4_;
          auVar144._8_4_ = fVar115 * auVar83._8_4_;
          auVar144._12_4_ = fVar117 * auVar83._12_4_;
          auVar144._16_4_ = auVar83._16_4_ * 0.0;
          auVar144._20_4_ = auVar83._20_4_ * 0.0;
          auVar144._24_4_ = auVar83._24_4_ * 0.0;
          auVar144._28_4_ = 0;
          auVar67 = vfmsub231ps_fma(auVar144,auVar82,auVar87);
          auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar80,ZEXT1632(auVar68));
          auVar149._0_4_ = auVar87._0_4_ * auVar106._0_4_;
          auVar149._4_4_ = auVar87._4_4_ * auVar106._4_4_;
          auVar149._8_4_ = auVar87._8_4_ * auVar106._8_4_;
          auVar149._12_4_ = auVar87._12_4_ * auVar106._12_4_;
          auVar149._16_4_ = auVar87._16_4_ * fVar156;
          auVar149._20_4_ = auVar87._20_4_ * fVar128;
          auVar149._24_4_ = auVar87._24_4_ * fVar135;
          auVar149._28_4_ = 0;
          auVar68 = vfmsub231ps_fma(auVar149,auVar74,auVar85);
          auVar75 = vfmadd231ps_avx512vl(auVar86,auVar80,ZEXT1632(auVar68));
          auVar86 = vmulps_avx512vl(auVar73,auVar107);
          auVar86 = vfmsub231ps_avx512vl(auVar86,auVar84,auVar109);
          auVar46._4_4_ = auVar72._4_4_ * auVar109._4_4_;
          auVar46._0_4_ = auVar72._0_4_ * auVar109._0_4_;
          auVar46._8_4_ = auVar72._8_4_ * auVar109._8_4_;
          auVar46._12_4_ = auVar72._12_4_ * auVar109._12_4_;
          auVar46._16_4_ = auVar72._16_4_ * fVar161;
          auVar46._20_4_ = auVar72._20_4_ * fVar162;
          auVar46._24_4_ = auVar72._24_4_ * fVar163;
          auVar46._28_4_ = iVar2;
          auVar68 = vfmsub231ps_fma(auVar46,auVar108,auVar73);
          auVar150._0_4_ = auVar108._0_4_ * auVar84._0_4_;
          auVar150._4_4_ = auVar108._4_4_ * auVar84._4_4_;
          auVar150._8_4_ = auVar108._8_4_ * auVar84._8_4_;
          auVar150._12_4_ = auVar108._12_4_ * auVar84._12_4_;
          auVar150._16_4_ = fVar136 * auVar84._16_4_;
          auVar150._20_4_ = fVar160 * auVar84._20_4_;
          auVar150._24_4_ = fVar137 * auVar84._24_4_;
          auVar150._28_4_ = 0;
          auVar67 = vfmsub231ps_fma(auVar150,auVar72,auVar107);
          auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar80,auVar86);
          auVar76 = vfmadd231ps_avx512vl(auVar86,auVar80,ZEXT1632(auVar68));
          auVar86 = vmaxps_avx(auVar75,auVar76);
          uVar129 = vcmpps_avx512vl(auVar86,auVar80,2);
          bVar63 = bVar63 & (byte)uVar129;
          if (bVar63 != 0) {
            auVar47._4_4_ = auVar73._4_4_ * auVar87._4_4_;
            auVar47._0_4_ = auVar73._0_4_ * auVar87._0_4_;
            auVar47._8_4_ = auVar73._8_4_ * auVar87._8_4_;
            auVar47._12_4_ = auVar73._12_4_ * auVar87._12_4_;
            auVar47._16_4_ = auVar73._16_4_ * auVar87._16_4_;
            auVar47._20_4_ = auVar73._20_4_ * auVar87._20_4_;
            auVar47._24_4_ = auVar73._24_4_ * auVar87._24_4_;
            auVar47._28_4_ = auVar86._28_4_;
            auVar121 = vfmsub231ps_fma(auVar47,auVar72,auVar85);
            auVar48._4_4_ = auVar85._4_4_ * auVar84._4_4_;
            auVar48._0_4_ = auVar85._0_4_ * auVar84._0_4_;
            auVar48._8_4_ = auVar85._8_4_ * auVar84._8_4_;
            auVar48._12_4_ = auVar85._12_4_ * auVar84._12_4_;
            auVar48._16_4_ = auVar85._16_4_ * auVar84._16_4_;
            auVar48._20_4_ = auVar85._20_4_ * auVar84._20_4_;
            auVar48._24_4_ = auVar85._24_4_ * auVar84._24_4_;
            auVar48._28_4_ = auVar85._28_4_;
            auVar67 = vfmsub231ps_fma(auVar48,auVar83,auVar73);
            auVar49._4_4_ = auVar72._4_4_ * auVar83._4_4_;
            auVar49._0_4_ = auVar72._0_4_ * auVar83._0_4_;
            auVar49._8_4_ = auVar72._8_4_ * auVar83._8_4_;
            auVar49._12_4_ = auVar72._12_4_ * auVar83._12_4_;
            auVar49._16_4_ = auVar72._16_4_ * auVar83._16_4_;
            auVar49._20_4_ = auVar72._20_4_ * auVar83._20_4_;
            auVar49._24_4_ = auVar72._24_4_ * auVar83._24_4_;
            auVar49._28_4_ = auVar72._28_4_;
            auVar17 = vfmsub231ps_fma(auVar49,auVar84,auVar87);
            auVar68 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar67),ZEXT1632(auVar17));
            auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar121),auVar80);
            auVar87 = vrcp14ps_avx512vl(auVar86);
            auVar84 = auVar180._0_32_;
            auVar85 = vfnmadd213ps_avx512vl(auVar87,auVar86,auVar84);
            auVar68 = vfmadd132ps_fma(auVar85,auVar87,auVar87);
            auVar50._4_4_ = auVar17._4_4_ * auVar106._4_4_;
            auVar50._0_4_ = auVar17._0_4_ * auVar106._0_4_;
            auVar50._8_4_ = auVar17._8_4_ * auVar106._8_4_;
            auVar50._12_4_ = auVar17._12_4_ * auVar106._12_4_;
            auVar50._16_4_ = fVar156 * 0.0;
            auVar50._20_4_ = fVar128 * 0.0;
            auVar50._24_4_ = fVar135 * 0.0;
            auVar50._28_4_ = iVar1;
            auVar67 = vfmadd231ps_fma(auVar50,auVar74,ZEXT1632(auVar67));
            auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar82,ZEXT1632(auVar121));
            fVar128 = auVar68._0_4_;
            fVar135 = auVar68._4_4_;
            fVar136 = auVar68._8_4_;
            fVar137 = auVar68._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar67._12_4_ * fVar137,
                                           CONCAT48(auVar67._8_4_ * fVar136,
                                                    CONCAT44(auVar67._4_4_ * fVar135,
                                                             auVar67._0_4_ * fVar128))));
            uVar129 = vcmpps_avx512vl(local_220,local_2e0,0xd);
            fVar156 = local_538->tfar;
            auVar25._4_4_ = fVar156;
            auVar25._0_4_ = fVar156;
            auVar25._8_4_ = fVar156;
            auVar25._12_4_ = fVar156;
            auVar25._16_4_ = fVar156;
            auVar25._20_4_ = fVar156;
            auVar25._24_4_ = fVar156;
            auVar25._28_4_ = fVar156;
            uVar21 = vcmpps_avx512vl(local_220,auVar25,2);
            bVar63 = (byte)uVar129 & (byte)uVar21 & bVar63;
            if (bVar63 != 0) {
              uVar129 = vcmpps_avx512vl(auVar86,auVar80,4);
              bVar63 = bVar63 & (byte)uVar129;
              auVar186 = ZEXT3264(local_420);
              auVar185 = ZEXT3264(local_3a0);
              auVar183 = ZEXT3264(local_440);
              auVar188 = ZEXT3264(local_460);
              auVar179 = ZEXT3264(local_3c0);
              auVar187 = ZEXT3264(local_480);
              if (bVar63 != 0) {
                fVar156 = auVar75._0_4_ * fVar128;
                fVar160 = auVar75._4_4_ * fVar135;
                auVar51._4_4_ = fVar160;
                auVar51._0_4_ = fVar156;
                fVar161 = auVar75._8_4_ * fVar136;
                auVar51._8_4_ = fVar161;
                fVar162 = auVar75._12_4_ * fVar137;
                auVar51._12_4_ = fVar162;
                fVar163 = auVar75._16_4_ * 0.0;
                auVar51._16_4_ = fVar163;
                fVar164 = auVar75._20_4_ * 0.0;
                auVar51._20_4_ = fVar164;
                fVar165 = auVar75._24_4_ * 0.0;
                auVar51._24_4_ = fVar165;
                auVar51._28_4_ = auVar86._28_4_;
                auVar87 = vsubps_avx512vl(auVar84,auVar51);
                local_260._0_4_ =
                     (float)((uint)(bVar55 & 1) * (int)fVar156 |
                            (uint)!(bool)(bVar55 & 1) * auVar87._0_4_);
                bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar11 * (int)fVar160 | (uint)!bVar11 * auVar87._4_4_);
                bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar11 * (int)fVar161 | (uint)!bVar11 * auVar87._8_4_);
                bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar11 * (int)fVar162 | (uint)!bVar11 * auVar87._12_4_);
                bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar11 * (int)fVar163 | (uint)!bVar11 * auVar87._16_4_);
                bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar11 * (int)fVar164 | (uint)!bVar11 * auVar87._20_4_);
                bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar11 * (int)fVar165 | (uint)!bVar11 * auVar87._24_4_);
                bVar11 = SUB81(uVar59 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar11 * auVar86._28_4_ | (uint)!bVar11 * auVar87._28_4_);
                auVar86 = vsubps_avx(ZEXT1632(auVar66),auVar79);
                auVar68 = vfmadd213ps_fma(auVar86,local_260,auVar79);
                fVar156 = local_520->depth_scale;
                auVar26._4_4_ = fVar156;
                auVar26._0_4_ = fVar156;
                auVar26._8_4_ = fVar156;
                auVar26._12_4_ = fVar156;
                auVar26._16_4_ = fVar156;
                auVar26._20_4_ = fVar156;
                auVar26._24_4_ = fVar156;
                auVar26._28_4_ = fVar156;
                auVar86 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                                             CONCAT48(auVar68._8_4_ + auVar68._8_4_,
                                                                      CONCAT44(auVar68._4_4_ +
                                                                               auVar68._4_4_,
                                                                               auVar68._0_4_ +
                                                                               auVar68._0_4_)))),
                                          auVar26);
                uVar129 = vcmpps_avx512vl(local_220,auVar86,6);
                if (((byte)uVar129 & bVar63) != 0) {
                  auVar127._0_4_ = auVar76._0_4_ * fVar128;
                  auVar127._4_4_ = auVar76._4_4_ * fVar135;
                  auVar127._8_4_ = auVar76._8_4_ * fVar136;
                  auVar127._12_4_ = auVar76._12_4_ * fVar137;
                  auVar127._16_4_ = auVar76._16_4_ * 0.0;
                  auVar127._20_4_ = auVar76._20_4_ * 0.0;
                  auVar127._24_4_ = auVar76._24_4_ * 0.0;
                  auVar127._28_4_ = 0;
                  auVar86 = vsubps_avx512vl(auVar84,auVar127);
                  auVar111._0_4_ =
                       (uint)(bVar55 & 1) * (int)auVar127._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * auVar86._0_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
                  auVar111._4_4_ =
                       (uint)bVar11 * (int)auVar127._4_4_ | (uint)!bVar11 * auVar86._4_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
                  auVar111._8_4_ =
                       (uint)bVar11 * (int)auVar127._8_4_ | (uint)!bVar11 * auVar86._8_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
                  auVar111._12_4_ =
                       (uint)bVar11 * (int)auVar127._12_4_ | (uint)!bVar11 * auVar86._12_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
                  auVar111._16_4_ =
                       (uint)bVar11 * (int)auVar127._16_4_ | (uint)!bVar11 * auVar86._16_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
                  auVar111._20_4_ =
                       (uint)bVar11 * (int)auVar127._20_4_ | (uint)!bVar11 * auVar86._20_4_;
                  bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
                  auVar111._24_4_ =
                       (uint)bVar11 * (int)auVar127._24_4_ | (uint)!bVar11 * auVar86._24_4_;
                  auVar111._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar86._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar111,auVar84,auVar27);
                  local_200 = (int)lVar57;
                  local_1fc = iVar8;
                  local_1f0 = local_3d0;
                  local_1e0 = local_3e0;
                  local_1d0 = local_510;
                  uStack_1c8 = uStack_508;
                  pGVar9 = (context->scene->geometries).items[uVar58].ptr;
                  if ((pGVar9->mask & local_538->mask) == 0) {
                    bVar55 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar55 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_490 = pGVar9;
                    auVar68 = vcvtsi2ss_avx512f(auVar180._0_16_,(int)lVar57);
                    fVar156 = auVar68._0_4_;
                    local_1a0[0] = (fVar156 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_1a0[1] = (fVar156 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_1a0[2] = (fVar156 + local_260._8_4_ + 2.0) * fStack_2f8;
                    local_1a0[3] = (fVar156 + local_260._12_4_ + 3.0) * fStack_2f4;
                    fStack_190 = (fVar156 + local_260._16_4_ + 4.0) * fStack_2f0;
                    fStack_18c = (fVar156 + local_260._20_4_ + 5.0) * fStack_2ec;
                    fStack_188 = (fVar156 + local_260._24_4_ + 6.0) * fStack_2e8;
                    fStack_184 = fVar156 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar56 = 0;
                    local_528 = (ulong)((byte)uVar129 & bVar63);
                    for (uVar58 = local_528; (uVar58 & 1) == 0;
                        uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                      lVar56 = lVar56 + 1;
                    }
                    local_498 = context;
                    while (local_528 != 0) {
                      local_4c4 = local_1a0[lVar56];
                      local_4c0 = *(undefined4 *)(local_180 + lVar56 * 4);
                      local_514 = local_538->tfar;
                      local_3f0._0_8_ = lVar56;
                      local_538->tfar = *(float *)(local_160 + lVar56 * 4);
                      local_500.context = local_498->user;
                      fVar156 = 1.0 - local_4c4;
                      auVar121 = vfnmadd231ss_fma(ZEXT416((uint)(local_4c4 * (fVar156 + fVar156))),
                                                  ZEXT416((uint)fVar156),ZEXT416((uint)fVar156));
                      auVar67 = ZEXT416((uint)local_4c4);
                      auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                                ZEXT416(0xc0a00000));
                      auVar66 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4 * 3.0)),
                                                ZEXT416((uint)(local_4c4 + local_4c4)),auVar68);
                      auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                                ZEXT416(0x40000000));
                      auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * -3.0)),
                                                ZEXT416((uint)(fVar156 + fVar156)),auVar68);
                      auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_4c4 * local_4c4)),auVar67,
                                                ZEXT416((uint)(fVar156 * -2.0)));
                      fVar156 = auVar121._0_4_ * 0.5;
                      fVar128 = auVar66._0_4_ * 0.5;
                      fVar135 = auVar68._0_4_ * 0.5;
                      fVar136 = auVar67._0_4_ * 0.5;
                      auVar142._0_4_ = fVar136 * local_380;
                      auVar142._4_4_ = fVar136 * fStack_37c;
                      auVar142._8_4_ = fVar136 * fStack_378;
                      auVar142._12_4_ = fVar136 * fStack_374;
                      auVar155._4_4_ = fVar135;
                      auVar155._0_4_ = fVar135;
                      auVar155._8_4_ = fVar135;
                      auVar155._12_4_ = fVar135;
                      auVar53._8_8_ = uStack_508;
                      auVar53._0_8_ = local_510;
                      auVar68 = vfmadd132ps_fma(auVar155,auVar142,auVar53);
                      auVar143._4_4_ = fVar128;
                      auVar143._0_4_ = fVar128;
                      auVar143._8_4_ = fVar128;
                      auVar143._12_4_ = fVar128;
                      auVar68 = vfmadd213ps_fma(auVar143,local_3e0,auVar68);
                      auVar134._4_4_ = fVar156;
                      auVar134._0_4_ = fVar156;
                      auVar134._8_4_ = fVar156;
                      auVar134._12_4_ = fVar156;
                      auVar68 = vfmadd213ps_fma(auVar134,local_3d0,auVar68);
                      local_4d0 = vmovlps_avx(auVar68);
                      local_4c8 = vextractps_avx(auVar68,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_530;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_54c = -1;
                      local_500.valid = &local_54c;
                      local_500.geometryUserPtr = local_490->userPtr;
                      local_500.ray = (RTCRayN *)local_538;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((local_490->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_490->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        auVar68 = auVar181._0_16_;
                        p_Var10 = local_498->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((local_498->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_490->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_500);
                          auVar68 = auVar181._0_16_;
                          if (*local_500.valid == 0) goto LAB_0180131c;
                        }
                        bVar55 = 1;
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar68 = vxorps_avx512vl(auVar68,auVar68);
                        goto LAB_018013f1;
                      }
LAB_0180131c:
                      local_538->tfar = local_514;
                      lVar56 = 0;
                      local_528 = local_528 ^ 1L << (local_3f0._0_8_ & 0x3f);
                      for (uVar58 = local_528; (uVar58 & 1) == 0;
                          uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                        lVar56 = lVar56 + 1;
                      }
                    }
                    bVar55 = 0;
                    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar68 = vxorps_avx512vl(auVar181._0_16_,auVar181._0_16_);
LAB_018013f1:
                    auVar181 = ZEXT1664(auVar68);
                    auVar180 = ZEXT3264(auVar86);
                    auVar182 = ZEXT3264(local_340);
                    auVar184 = ZEXT3264(local_360);
                    auVar186 = ZEXT3264(local_420);
                    auVar185 = ZEXT3264(local_3a0);
                    auVar183 = ZEXT3264(local_440);
                    auVar188 = ZEXT3264(local_460);
                    auVar179 = ZEXT3264(local_3c0);
                    auVar187 = ZEXT3264(local_480);
                    context = local_498;
                    uVar58 = local_530;
                  }
                  bVar60 = (bool)(bVar60 | bVar55);
                }
              }
              goto LAB_01801360;
            }
          }
          auVar186 = ZEXT3264(local_420);
          auVar185 = ZEXT3264(local_3a0);
          auVar183 = ZEXT3264(local_440);
          auVar188 = ZEXT3264(local_460);
          auVar179 = ZEXT3264(local_3c0);
          auVar187 = ZEXT3264(local_480);
        }
LAB_01801360:
      }
    }
    if (bVar60) break;
    fVar156 = local_538->tfar;
    auVar22._4_4_ = fVar156;
    auVar22._0_4_ = fVar156;
    auVar22._8_4_ = fVar156;
    auVar22._12_4_ = fVar156;
    uVar129 = vcmpps_avx512vl(local_270,auVar22,2);
    local_368 = (ulong)((uint)uVar61 & (uint)uVar129);
  }
  return local_368 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }